

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

void embree::avx512::ConeCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  ulong uVar74;
  ulong uVar75;
  byte bVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  byte bVar85;
  uint uVar86;
  uint uVar87;
  undefined1 auVar88 [8];
  uint uVar89;
  byte bVar90;
  uint uVar91;
  ulong uVar92;
  byte bVar93;
  ulong uVar94;
  ulong uVar95;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  float fVar162;
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [64];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined4 uVar175;
  undefined1 auVar176 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  uint local_5a0 [4];
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  uint local_520 [4];
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500 [4];
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  RTCHitN local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  int iVar96;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  undefined1 auVar177 [64];
  
  pSVar9 = context->scene;
  pGVar10 = (pSVar9->geometries).items[line->sharedGeomID].ptr;
  uVar91 = (line->v0).field_0.i[0];
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar87 = (line->v0).field_0.i[1];
  uVar86 = (line->v0).field_0.i[2];
  uVar89 = (line->v0).field_0.i[3];
  uVar5 = (line->v0).field_0.i[4];
  auVar111._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar111._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar91 * (long)p_Var12);
  uVar6 = (line->v0).field_0.i[5];
  auVar129._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  auVar129._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar87 * (long)p_Var12);
  uVar7 = (line->v0).field_0.i[6];
  auVar107._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar107._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar86 * (long)p_Var12);
  uVar8 = (line->v0).field_0.i[7];
  auVar108._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar108._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar89 * (long)p_Var12);
  auVar97 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar122._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar91 + 1) * (long)p_Var12);
  auVar122._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  auVar97 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar150._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar87 + 1) * (long)p_Var12);
  auVar150._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  auVar97 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar152._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar86 + 1) * (long)p_Var12);
  auVar152._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  auVar97 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar154._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar89 + 1) * (long)p_Var12);
  auVar154._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  local_100 = vpbroadcastd_avx512vl();
  auVar103 = vunpcklps_avx(auVar111,auVar107);
  auVar101 = vunpckhps_avx(auVar111,auVar107);
  auVar111 = vunpcklps_avx(auVar129,auVar108);
  auVar102 = vunpckhps_avx(auVar129,auVar108);
  auVar107 = vunpcklps_avx(auVar103,auVar111);
  auVar111 = vunpckhps_avx(auVar103,auVar111);
  auVar108 = vunpcklps_avx(auVar101,auVar102);
  auVar129 = vunpckhps_avx(auVar101,auVar102);
  auVar103 = vpunpckldq_avx2(auVar122,auVar152);
  auVar101 = vpunpckhdq_avx2(auVar122,auVar152);
  auVar122 = vpunpckldq_avx2(auVar150,auVar154);
  auVar102 = vpunpckhdq_avx2(auVar150,auVar154);
  auVar152 = vpunpckldq_avx2(auVar103,auVar122);
  auVar122 = vpunpckhdq_avx2(auVar103,auVar122);
  auVar154 = vpunpckldq_avx2(auVar101,auVar102);
  auVar150 = vpunpckhdq_avx2(auVar101,auVar102);
  auVar101 = vpcmpeqd_avx2(auVar103,auVar103);
  uVar75 = vpcmpd_avx512vl(auVar101,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar105._4_4_ = fVar1;
  auVar105._0_4_ = fVar1;
  auVar105._8_4_ = fVar1;
  auVar105._12_4_ = fVar1;
  auVar105._16_4_ = fVar1;
  auVar105._20_4_ = fVar1;
  auVar105._24_4_ = fVar1;
  auVar105._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar106._4_4_ = fVar2;
  auVar106._0_4_ = fVar2;
  auVar106._8_4_ = fVar2;
  auVar106._12_4_ = fVar2;
  auVar106._16_4_ = fVar2;
  auVar106._20_4_ = fVar2;
  auVar106._24_4_ = fVar2;
  auVar106._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  auVar109._4_4_ = fVar3;
  auVar109._0_4_ = fVar3;
  auVar109._8_4_ = fVar3;
  auVar109._12_4_ = fVar3;
  auVar109._16_4_ = fVar3;
  auVar109._20_4_ = fVar3;
  auVar109._24_4_ = fVar3;
  auVar109._28_4_ = fVar3;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar186 = ZEXT3264(auVar98);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar187 = ZEXT3264(auVar99);
  auVar100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar188 = ZEXT3264(auVar100);
  auVar97 = vmulss_avx512f(auVar100._0_16_,auVar100._0_16_);
  auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar99,auVar99);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
  auVar103._0_4_ = auVar101._0_4_;
  auVar103._4_4_ = auVar103._0_4_;
  auVar103._8_4_ = auVar103._0_4_;
  auVar103._12_4_ = auVar103._0_4_;
  auVar103._16_4_ = auVar103._0_4_;
  auVar103._20_4_ = auVar103._0_4_;
  auVar103._24_4_ = auVar103._0_4_;
  auVar103._28_4_ = auVar103._0_4_;
  auVar102 = vrcp14ps_avx512vl(auVar103);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar101 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar101);
  auVar97 = vfmadd132ps_fma(auVar101,auVar102,auVar102);
  auVar104._0_4_ = auVar107._0_4_ + auVar152._0_4_;
  auVar104._4_4_ = auVar107._4_4_ + auVar152._4_4_;
  auVar104._8_4_ = auVar107._8_4_ + auVar152._8_4_;
  auVar104._12_4_ = auVar107._12_4_ + auVar152._12_4_;
  auVar104._16_4_ = auVar107._16_4_ + auVar152._16_4_;
  auVar104._20_4_ = auVar107._20_4_ + auVar152._20_4_;
  auVar104._24_4_ = auVar107._24_4_ + auVar152._24_4_;
  auVar104._28_4_ = auVar107._28_4_ + auVar152._28_4_;
  auVar110._0_4_ = auVar122._0_4_ + auVar111._0_4_;
  auVar110._4_4_ = auVar122._4_4_ + auVar111._4_4_;
  auVar110._8_4_ = auVar122._8_4_ + auVar111._8_4_;
  auVar110._12_4_ = auVar122._12_4_ + auVar111._12_4_;
  auVar110._16_4_ = auVar122._16_4_ + auVar111._16_4_;
  auVar110._20_4_ = auVar122._20_4_ + auVar111._20_4_;
  auVar110._24_4_ = auVar122._24_4_ + auVar111._24_4_;
  auVar110._28_4_ = auVar122._28_4_ + auVar111._28_4_;
  auVar112._0_4_ = auVar108._0_4_ + auVar154._0_4_;
  auVar112._4_4_ = auVar108._4_4_ + auVar154._4_4_;
  auVar112._8_4_ = auVar108._8_4_ + auVar154._8_4_;
  auVar112._12_4_ = auVar108._12_4_ + auVar154._12_4_;
  auVar112._16_4_ = auVar108._16_4_ + auVar154._16_4_;
  auVar112._20_4_ = auVar108._20_4_ + auVar154._20_4_;
  auVar112._24_4_ = auVar108._24_4_ + auVar154._24_4_;
  auVar112._28_4_ = auVar108._28_4_ + auVar154._28_4_;
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar102 = vmulps_avx512vl(auVar104,auVar101);
  auVar103 = vmulps_avx512vl(auVar110,auVar101);
  auVar104 = vmulps_avx512vl(auVar112,auVar101);
  auVar101 = vsubps_avx(auVar102,auVar105);
  auVar102 = vsubps_avx(auVar103,auVar106);
  auVar103 = vsubps_avx(auVar104,auVar109);
  auVar103 = vmulps_avx512vl(auVar103,auVar100);
  auVar102 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar102);
  auVar101 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar101);
  auVar139._0_4_ = auVar101._0_4_ * auVar97._0_4_;
  auVar139._4_4_ = auVar101._4_4_ * auVar97._4_4_;
  auVar139._8_4_ = auVar101._8_4_ * auVar97._8_4_;
  auVar139._12_4_ = auVar101._12_4_ * auVar97._12_4_;
  auVar139._16_4_ = auVar101._16_4_ * 0.0;
  auVar139._20_4_ = auVar101._20_4_ * 0.0;
  auVar139._24_4_ = auVar101._24_4_ * 0.0;
  auVar139._28_4_ = 0;
  auVar101 = vmulps_avx512vl(auVar98,auVar139);
  auVar102 = vmulps_avx512vl(auVar99,auVar139);
  auVar103 = vmulps_avx512vl(auVar100,auVar139);
  auVar116._0_4_ = auVar101._0_4_ + fVar1;
  auVar116._4_4_ = auVar101._4_4_ + fVar1;
  auVar116._8_4_ = auVar101._8_4_ + fVar1;
  auVar116._12_4_ = auVar101._12_4_ + fVar1;
  auVar116._16_4_ = auVar101._16_4_ + fVar1;
  auVar116._20_4_ = auVar101._20_4_ + fVar1;
  auVar116._24_4_ = auVar101._24_4_ + fVar1;
  auVar116._28_4_ = auVar101._28_4_ + fVar1;
  auVar117._0_4_ = auVar102._0_4_ + fVar2;
  auVar117._4_4_ = auVar102._4_4_ + fVar2;
  auVar117._8_4_ = auVar102._8_4_ + fVar2;
  auVar117._12_4_ = auVar102._12_4_ + fVar2;
  auVar117._16_4_ = auVar102._16_4_ + fVar2;
  auVar117._20_4_ = auVar102._20_4_ + fVar2;
  auVar117._24_4_ = auVar102._24_4_ + fVar2;
  auVar117._28_4_ = auVar102._28_4_ + fVar2;
  auVar118._0_4_ = fVar3 + auVar103._0_4_;
  auVar118._4_4_ = fVar3 + auVar103._4_4_;
  auVar118._8_4_ = fVar3 + auVar103._8_4_;
  auVar118._12_4_ = fVar3 + auVar103._12_4_;
  auVar118._16_4_ = fVar3 + auVar103._16_4_;
  auVar118._20_4_ = fVar3 + auVar103._20_4_;
  auVar118._24_4_ = fVar3 + auVar103._24_4_;
  auVar118._28_4_ = fVar3 + auVar103._28_4_;
  auVar104 = vsubps_avx512vl(auVar152,auVar107);
  auVar189 = ZEXT3264(auVar104);
  auVar105 = vsubps_avx512vl(auVar122,auVar111);
  auVar190 = ZEXT3264(auVar105);
  auVar106 = vsubps_avx512vl(auVar154,auVar108);
  auVar191 = ZEXT3264(auVar106);
  _local_620 = vsubps_avx(auVar116,auVar107);
  auVar107 = vsubps_avx512vl(auVar117,auVar111);
  auVar193 = ZEXT3264(auVar107);
  _local_4e0 = vsubps_avx512vl(auVar118,auVar108);
  auVar101 = vmulps_avx512vl(auVar106,auVar106);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,auVar105);
  auVar108 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar104);
  auVar101 = vmulps_avx512vl(auVar106,_local_4e0);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar105);
  auVar109 = vfmadd231ps_avx512vl(auVar101,_local_620,auVar104);
  auVar101 = vmulps_avx512vl(auVar106,auVar100);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar105);
  auVar110 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar104);
  auVar101 = vsubps_avx(auVar129,auVar150);
  fVar1 = auVar101._0_4_;
  fVar3 = auVar101._4_4_;
  fVar55 = auVar101._8_4_;
  fVar58 = auVar101._12_4_;
  fVar61 = auVar101._16_4_;
  fVar64 = auVar101._20_4_;
  fVar67 = auVar101._24_4_;
  auVar144._0_4_ = fVar1 * fVar1 + auVar108._0_4_;
  auVar144._4_4_ = fVar3 * fVar3 + auVar108._4_4_;
  auVar144._8_4_ = fVar55 * fVar55 + auVar108._8_4_;
  auVar144._12_4_ = fVar58 * fVar58 + auVar108._12_4_;
  auVar144._16_4_ = fVar61 * fVar61 + auVar108._16_4_;
  auVar144._20_4_ = fVar64 * fVar64 + auVar108._20_4_;
  auVar144._24_4_ = fVar67 * fVar67 + auVar108._24_4_;
  auVar144._28_4_ = auVar111._28_4_ + auVar108._28_4_;
  auVar102 = vmulps_avx512vl(auVar100,_local_4e0);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar107);
  auVar111 = vfmadd231ps_avx512vl(auVar102,auVar98,_local_620);
  auVar103 = _local_4e0;
  auVar102 = vmulps_avx512vl(_local_4e0,_local_4e0);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar107);
  auVar112 = vfmadd231ps_avx512vl(auVar102,_local_620,_local_620);
  auVar113 = vmulps_avx512vl(auVar108,auVar108);
  auVar195 = ZEXT3264(auVar113);
  auVar114 = vmulps_avx512vl(auVar129,auVar108);
  fVar2 = auVar110._0_4_;
  fVar163 = fVar2 * fVar2;
  fVar53 = auVar110._4_4_;
  fVar165 = fVar53 * fVar53;
  auVar102._4_4_ = fVar165;
  auVar102._0_4_ = fVar163;
  fVar56 = auVar110._8_4_;
  fVar166 = fVar56 * fVar56;
  auVar102._8_4_ = fVar166;
  fVar59 = auVar110._12_4_;
  fVar167 = fVar59 * fVar59;
  auVar102._12_4_ = fVar167;
  fVar62 = auVar110._16_4_;
  fVar168 = fVar62 * fVar62;
  auVar102._16_4_ = fVar168;
  fVar65 = auVar110._20_4_;
  fVar169 = fVar65 * fVar65;
  auVar102._20_4_ = fVar169;
  fVar68 = auVar110._24_4_;
  fVar170 = fVar68 * fVar68;
  auVar102._24_4_ = fVar170;
  auVar102._28_4_ = local_620._28_4_;
  auVar102 = vmulps_avx512vl(auVar144,auVar102);
  auVar102 = vsubps_avx512vl(auVar113,auVar102);
  auVar111 = vmulps_avx512vl(auVar113,auVar111);
  auVar115 = vmulps_avx512vl(auVar110,auVar109);
  auVar115 = vmulps_avx512vl(auVar144,auVar115);
  auVar111 = vsubps_avx512vl(auVar111,auVar115);
  auVar115 = vmulps_avx512vl(auVar101,auVar110);
  auVar115 = vmulps_avx512vl(auVar114,auVar115);
  auVar111 = vaddps_avx512vl(auVar115,auVar111);
  auVar112 = vmulps_avx512vl(auVar113,auVar112);
  auVar115 = vmulps_avx512vl(auVar109,auVar109);
  auVar115 = vmulps_avx512vl(auVar144,auVar115);
  auVar112 = vsubps_avx512vl(auVar112,auVar115);
  auVar101 = vaddps_avx512vl(auVar101,auVar101);
  auVar101 = vmulps_avx512vl(auVar101,auVar109);
  auVar101 = vsubps_avx512vl(auVar101,auVar114);
  auVar101 = vmulps_avx512vl(auVar114,auVar101);
  auVar101 = vaddps_avx512vl(auVar112,auVar101);
  auVar112 = vmulps_avx512vl(auVar111,auVar111);
  auVar101 = vmulps_avx512vl(auVar102,auVar101);
  auVar101 = vsubps_avx512vl(auVar112,auVar101);
  auVar112 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar95 = vcmpps_avx512vl(auVar101,auVar112,5);
  bVar85 = (byte)(uVar75 & uVar95);
  if (bVar85 != 0) {
    auVar152 = vsubps_avx(auVar116,auVar152);
    auVar122 = vsubps_avx(auVar117,auVar122);
    auVar154 = vsubps_avx(auVar118,auVar154);
    auVar116 = vsqrtps_avx512vl(auVar101);
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar101 = vrcp14ps_avx512vl(auVar102);
    auVar118 = vfnmadd213ps_avx512vl(auVar101,auVar102,auVar117);
    auVar114._8_4_ = 0x7fffffff;
    auVar114._0_8_ = 0x7fffffff7fffffff;
    auVar114._12_4_ = 0x7fffffff;
    auVar114._16_4_ = 0x7fffffff;
    auVar114._20_4_ = 0x7fffffff;
    auVar114._24_4_ = 0x7fffffff;
    auVar114._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar102,auVar114);
    auVar115._8_4_ = 0x219392ef;
    auVar115._0_8_ = 0x219392ef219392ef;
    auVar115._12_4_ = 0x219392ef;
    auVar115._16_4_ = 0x219392ef;
    auVar115._20_4_ = 0x219392ef;
    auVar115._24_4_ = 0x219392ef;
    auVar115._28_4_ = 0x219392ef;
    uVar92 = vcmpps_avx512vl(auVar118,auVar115,2);
    auVar102 = vfmadd132ps_avx512vl(auVar118,auVar101,auVar101);
    auVar151._8_4_ = 0x80000000;
    auVar151._0_8_ = 0x8000000080000000;
    auVar151._12_4_ = 0x80000000;
    auVar151._16_4_ = 0x80000000;
    auVar151._20_4_ = 0x80000000;
    auVar151._24_4_ = 0x80000000;
    auVar151._28_4_ = 0x80000000;
    auVar101 = vxorps_avx512vl(auVar111,auVar151);
    auVar101 = vsubps_avx(auVar101,auVar116);
    auVar101 = vmulps_avx512vl(auVar101,auVar102);
    auVar173._8_4_ = 0xff800000;
    auVar173._0_8_ = 0xff800000ff800000;
    auVar173._12_4_ = 0xff800000;
    auVar173._16_4_ = 0xff800000;
    auVar173._20_4_ = 0xff800000;
    auVar173._24_4_ = 0xff800000;
    auVar173._28_4_ = 0xff800000;
    bVar13 = (bool)((byte)uVar92 & 1);
    auVar119._0_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._0_4_;
    bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
    auVar119._4_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._4_4_;
    bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
    auVar119._8_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._8_4_;
    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
    auVar119._12_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._12_4_;
    bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
    auVar119._16_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._16_4_;
    bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
    auVar119._20_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._20_4_;
    bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
    auVar119._24_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._24_4_;
    bVar13 = SUB81(uVar92 >> 7,0);
    auVar119._28_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._28_4_;
    auVar101 = vsubps_avx512vl(auVar116,auVar111);
    auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar185 = ZEXT3264(auVar114);
    auVar101 = vmulps_avx512vl(auVar101,auVar102);
    bVar13 = (bool)((byte)uVar92 & 1);
    iVar96 = auVar114._0_4_;
    auVar120._0_4_ = (uint)bVar13 * iVar96 | (uint)!bVar13 * auVar101._0_4_;
    bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
    iVar132 = auVar114._4_4_;
    auVar120._4_4_ = (uint)bVar13 * iVar132 | (uint)!bVar13 * auVar101._4_4_;
    bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
    iVar133 = auVar114._8_4_;
    auVar120._8_4_ = (uint)bVar13 * iVar133 | (uint)!bVar13 * auVar101._8_4_;
    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
    iVar134 = auVar114._12_4_;
    auVar120._12_4_ = (uint)bVar13 * iVar134 | (uint)!bVar13 * auVar101._12_4_;
    bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
    iVar135 = auVar114._16_4_;
    auVar120._16_4_ = (uint)bVar13 * iVar135 | (uint)!bVar13 * auVar101._16_4_;
    bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
    iVar136 = auVar114._20_4_;
    auVar120._20_4_ = (uint)bVar13 * iVar136 | (uint)!bVar13 * auVar101._20_4_;
    bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
    iVar137 = auVar114._24_4_;
    iVar138 = auVar114._28_4_;
    auVar120._24_4_ = (uint)bVar13 * iVar137 | (uint)!bVar13 * auVar101._24_4_;
    bVar13 = SUB81(uVar92 >> 7,0);
    auVar120._28_4_ = (uint)bVar13 * iVar138 | (uint)!bVar13 * auVar101._28_4_;
    auVar101 = vmulps_avx512vl(auVar110,auVar119);
    auVar171._0_4_ = auVar109._0_4_ + auVar101._0_4_;
    auVar171._4_4_ = auVar109._4_4_ + auVar101._4_4_;
    auVar171._8_4_ = auVar109._8_4_ + auVar101._8_4_;
    auVar171._12_4_ = auVar109._12_4_ + auVar101._12_4_;
    auVar171._16_4_ = auVar109._16_4_ + auVar101._16_4_;
    auVar171._20_4_ = auVar109._20_4_ + auVar101._20_4_;
    auVar171._24_4_ = auVar109._24_4_ + auVar101._24_4_;
    fVar162 = auVar109._28_4_;
    auVar171._28_4_ = fVar162 + auVar101._28_4_;
    auVar101 = vmulps_avx512vl(auVar110,auVar120);
    auVar115 = vaddps_avx512vl(auVar109,auVar101);
    auVar194 = ZEXT3264(auVar115);
    uVar70 = vcmpps_avx512vl(auVar171,auVar108,1);
    uVar71 = vcmpps_avx512vl(auVar171,auVar112,6);
    uVar72 = vcmpps_avx512vl(auVar115,auVar108,1);
    uVar73 = vcmpps_avx512vl(auVar115,auVar112,6);
    auVar164._0_4_ = fVar2 * (float)local_620._0_4_;
    auVar164._4_4_ = fVar53 * (float)local_620._4_4_;
    auVar164._8_4_ = fVar56 * fStack_618;
    auVar164._12_4_ = fVar59 * fStack_614;
    auVar164._16_4_ = fVar62 * fStack_610;
    auVar164._20_4_ = fVar65 * fStack_60c;
    auVar164._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
    auVar164._24_4_ = fVar68 * fStack_608;
    auVar101 = vmulps_avx512vl(auVar110,auVar107);
    auVar102 = vmulps_avx512vl(auVar110,_local_4e0);
    auVar111 = vmulps_avx512vl(auVar98,auVar109);
    auVar111 = vsubps_avx512vl(auVar164._0_32_,auVar111);
    auVar112 = vmulps_avx512vl(auVar99,auVar109);
    auVar101 = vsubps_avx512vl(auVar101,auVar112);
    auVar112 = vmulps_avx512vl(auVar100,auVar109);
    auVar102 = vsubps_avx512vl(auVar102,auVar112);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar111,auVar111);
    fVar52 = auVar129._0_4_;
    fVar54 = auVar129._4_4_;
    fVar57 = auVar129._8_4_;
    fVar60 = auVar129._12_4_;
    fVar63 = auVar129._16_4_;
    fVar66 = auVar129._20_4_;
    fVar69 = auVar129._24_4_;
    auVar77._4_4_ = fVar54 * fVar54 * fVar165;
    auVar77._0_4_ = fVar52 * fVar52 * fVar163;
    auVar77._8_4_ = fVar57 * fVar57 * fVar166;
    auVar77._12_4_ = fVar60 * fVar60 * fVar167;
    auVar77._16_4_ = fVar63 * fVar63 * fVar168;
    auVar77._20_4_ = fVar66 * fVar66 * fVar169;
    auVar77._24_4_ = fVar69 * fVar69 * fVar170;
    auVar77._28_4_ = auVar111._28_4_;
    uVar92 = vcmpps_avx512vl(auVar101,auVar77,1);
    uVar92 = (bVar85 & ~(byte)line->leftExists) & uVar92;
    auVar101 = vrcp14ps_avx512vl(auVar110);
    auVar102 = vfnmadd213ps_avx512vl(auVar101,auVar110,auVar117);
    auVar112 = vfmadd132ps_avx512vl(auVar102,auVar101,auVar101);
    auVar157._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
    auVar157._8_4_ = -auVar109._8_4_;
    auVar157._12_4_ = -auVar109._12_4_;
    auVar157._16_4_ = -auVar109._16_4_;
    auVar157._20_4_ = -auVar109._20_4_;
    auVar157._24_4_ = -auVar109._24_4_;
    auVar157._28_4_ = -fVar162;
    auVar101 = vmulps_avx512vl(auVar112,auVar157);
    bVar13 = (bool)((byte)uVar92 & 1);
    auVar121._0_4_ = (uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * iVar96;
    bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
    auVar121._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * iVar132;
    bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
    auVar121._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * iVar133;
    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
    auVar121._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * iVar134;
    bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
    auVar121._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * iVar135;
    bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
    auVar121._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * iVar136;
    bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
    auVar121._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * iVar137;
    bVar13 = SUB81(uVar92 >> 7,0);
    auVar121._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * iVar138;
    auVar184 = ZEXT3264(auVar121);
    auVar101 = vmulps_avx512vl(auVar106,auVar154);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar122,auVar105);
    auVar109 = vfmadd231ps_avx512vl(auVar101,auVar152,auVar104);
    auVar78._4_4_ = auVar152._4_4_ * fVar53;
    auVar78._0_4_ = auVar152._0_4_ * fVar2;
    auVar78._8_4_ = auVar152._8_4_ * fVar56;
    auVar78._12_4_ = auVar152._12_4_ * fVar59;
    auVar78._16_4_ = auVar152._16_4_ * fVar62;
    auVar78._20_4_ = auVar152._20_4_ * fVar65;
    auVar78._24_4_ = auVar152._24_4_ * fVar68;
    auVar78._28_4_ = fVar162;
    auVar79._4_4_ = auVar122._4_4_ * fVar53;
    auVar79._0_4_ = auVar122._0_4_ * fVar2;
    auVar79._8_4_ = auVar122._8_4_ * fVar56;
    auVar79._12_4_ = auVar122._12_4_ * fVar59;
    auVar79._16_4_ = auVar122._16_4_ * fVar62;
    auVar79._20_4_ = auVar122._20_4_ * fVar65;
    auVar79._24_4_ = auVar122._24_4_ * fVar68;
    auVar79._28_4_ = auVar152._28_4_;
    auVar80._4_4_ = auVar154._4_4_ * fVar53;
    auVar80._0_4_ = auVar154._0_4_ * fVar2;
    auVar80._8_4_ = auVar154._8_4_ * fVar56;
    auVar80._12_4_ = auVar154._12_4_ * fVar59;
    auVar80._16_4_ = auVar154._16_4_ * fVar62;
    auVar80._20_4_ = auVar154._20_4_ * fVar65;
    auVar80._24_4_ = auVar154._24_4_ * fVar68;
    auVar80._28_4_ = auVar110._28_4_;
    auVar101 = vmulps_avx512vl(auVar98,auVar109);
    auVar101 = vsubps_avx(auVar78,auVar101);
    auVar102 = vmulps_avx512vl(auVar99,auVar109);
    auVar102 = vsubps_avx(auVar79,auVar102);
    auVar122 = vmulps_avx512vl(auVar100,auVar109);
    auVar111 = vsubps_avx(auVar80,auVar122);
    auVar81._4_4_ = auVar111._4_4_ * auVar111._4_4_;
    auVar81._0_4_ = auVar111._0_4_ * auVar111._0_4_;
    auVar81._8_4_ = auVar111._8_4_ * auVar111._8_4_;
    auVar81._12_4_ = auVar111._12_4_ * auVar111._12_4_;
    auVar81._16_4_ = auVar111._16_4_ * auVar111._16_4_;
    auVar81._20_4_ = auVar111._20_4_ * auVar111._20_4_;
    auVar81._24_4_ = auVar111._24_4_ * auVar111._24_4_;
    auVar81._28_4_ = auVar111._28_4_;
    auVar97 = vfmadd231ps_fma(auVar81,auVar102,auVar102);
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar101,auVar101);
    auVar82._4_4_ = fVar165 * auVar150._4_4_ * auVar150._4_4_;
    auVar82._0_4_ = fVar163 * auVar150._0_4_ * auVar150._0_4_;
    auVar82._8_4_ = fVar166 * auVar150._8_4_ * auVar150._8_4_;
    auVar82._12_4_ = fVar167 * auVar150._12_4_ * auVar150._12_4_;
    auVar82._16_4_ = fVar168 * auVar150._16_4_ * auVar150._16_4_;
    auVar82._20_4_ = fVar169 * auVar150._20_4_ * auVar150._20_4_;
    auVar82._24_4_ = fVar170 * auVar150._24_4_ * auVar150._24_4_;
    auVar82._28_4_ = auVar150._28_4_;
    uVar175 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar160._4_4_ = uVar175;
    auVar160._0_4_ = uVar175;
    auVar160._8_4_ = uVar175;
    auVar160._12_4_ = uVar175;
    auVar160._16_4_ = uVar175;
    auVar160._20_4_ = uVar175;
    auVar160._24_4_ = uVar175;
    auVar160._28_4_ = uVar175;
    bVar93 = (byte)uVar70 & (byte)uVar71 & bVar85;
    auVar101 = vblendmps_avx512vl(auVar114,auVar119);
    auVar123._0_4_ =
         (uint)(bVar93 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar122._0_4_;
    bVar13 = (bool)(bVar93 >> 1 & 1);
    auVar123._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar122._4_4_;
    bVar13 = (bool)(bVar93 >> 2 & 1);
    auVar123._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar122._8_4_;
    bVar13 = (bool)(bVar93 >> 3 & 1);
    auVar123._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar122._12_4_;
    bVar13 = (bool)(bVar93 >> 4 & 1);
    auVar123._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar122._16_4_;
    bVar13 = (bool)(bVar93 >> 5 & 1);
    auVar123._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar122._20_4_;
    bVar13 = (bool)(bVar93 >> 6 & 1);
    auVar123._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar122._24_4_;
    auVar123._28_4_ =
         (uint)(bVar93 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar93 >> 7) * auVar122._28_4_;
    auVar178 = ZEXT3264(auVar123);
    bVar93 = (byte)uVar72 & (byte)uVar73 & bVar85;
    auVar101 = vblendmps_avx512vl(auVar173,auVar120);
    auVar124._0_4_ =
         (uint)(bVar93 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar93 & 1) * (int)auVar154._0_4_;
    bVar13 = (bool)(bVar93 >> 1 & 1);
    auVar124._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * (int)auVar154._4_4_;
    bVar13 = (bool)(bVar93 >> 2 & 1);
    auVar124._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * (int)auVar154._8_4_;
    bVar13 = (bool)(bVar93 >> 3 & 1);
    auVar124._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * (int)auVar154._12_4_;
    bVar13 = (bool)(bVar93 >> 4 & 1);
    auVar124._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * (int)auVar154._16_4_;
    bVar13 = (bool)(bVar93 >> 5 & 1);
    auVar124._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * (int)auVar154._20_4_;
    bVar13 = (bool)(bVar93 >> 6 & 1);
    auVar124._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * (int)auVar154._24_4_;
    auVar124._28_4_ =
         (uint)(bVar93 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar93 >> 7) * auVar154._28_4_;
    auVar179 = ZEXT3264(auVar124);
    auVar158._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
    auVar158._8_4_ = auVar109._8_4_ ^ 0x80000000;
    auVar158._12_4_ = auVar109._12_4_ ^ 0x80000000;
    auVar158._16_4_ = auVar109._16_4_ ^ 0x80000000;
    auVar158._20_4_ = auVar109._20_4_ ^ 0x80000000;
    auVar158._24_4_ = auVar109._24_4_ ^ 0x80000000;
    auVar158._28_4_ = auVar109._28_4_ ^ 0x80000000;
    uVar92 = vcmpps_avx512vl(ZEXT1632(auVar97),auVar82,1);
    uVar92 = (bVar85 & ~(byte)line->rightExists) & uVar92;
    auVar101 = vmulps_avx512vl(auVar112,auVar158);
    bVar13 = (bool)((byte)uVar92 & 1);
    auVar125._0_4_ = (uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * iVar96;
    bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
    auVar125._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * iVar132;
    bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
    auVar125._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * iVar133;
    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
    auVar125._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * iVar134;
    bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
    auVar125._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * iVar135;
    bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
    auVar125._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * iVar136;
    bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
    auVar125._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * iVar137;
    bVar13 = SUB81(uVar92 >> 7,0);
    auVar125._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * iVar138;
    auVar102 = vminps_avx512vl(auVar121,auVar125);
    auVar111 = vmaxps_avx512vl(auVar121,auVar125);
    auVar101 = vminps_avx(auVar123,auVar102);
    uVar92 = vcmpps_avx512vl(auVar101,auVar102,0);
    uVar74 = vcmpps_avx512vl(auVar111,auVar114,0);
    bVar13 = (bool)((byte)uVar74 & 1);
    bVar16 = (bool)((byte)(uVar74 >> 1) & 1);
    bVar18 = (bool)((byte)(uVar74 >> 2) & 1);
    bVar20 = (bool)((byte)(uVar74 >> 3) & 1);
    bVar23 = (bool)((byte)(uVar74 >> 4) & 1);
    bVar31 = (bool)((byte)(uVar74 >> 5) & 1);
    bVar39 = (bool)((byte)(uVar74 >> 6) & 1);
    bVar47 = SUB81(uVar74 >> 7,0);
    uVar74 = vcmpps_avx512vl(auVar102,auVar114,0);
    bVar14 = (bool)((byte)uVar74 & 1);
    bVar17 = (bool)((byte)(uVar74 >> 1) & 1);
    bVar19 = (bool)((byte)(uVar74 >> 2) & 1);
    bVar21 = (bool)((byte)(uVar74 >> 3) & 1);
    bVar24 = (bool)((byte)(uVar74 >> 4) & 1);
    bVar32 = (bool)((byte)(uVar74 >> 5) & 1);
    bVar40 = (bool)((byte)(uVar74 >> 6) & 1);
    bVar48 = SUB81(uVar74 >> 7,0);
    bVar15 = (bool)((byte)uVar92 & 1);
    auVar126._0_4_ =
         (uint)bVar15 * ((uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar111._0_4_) |
         (uint)!bVar15 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar102._0_4_);
    bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
    auVar126._4_4_ =
         (uint)bVar13 * ((uint)bVar16 * -0x800000 | (uint)!bVar16 * auVar111._4_4_) |
         (uint)!bVar13 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar102._4_4_);
    bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
    auVar126._8_4_ =
         (uint)bVar13 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar111._8_4_) |
         (uint)!bVar13 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar102._8_4_);
    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
    auVar126._12_4_ =
         (uint)bVar13 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar111._12_4_) |
         (uint)!bVar13 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar102._12_4_);
    bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
    auVar126._16_4_ =
         (uint)bVar13 * ((uint)bVar23 * -0x800000 | (uint)!bVar23 * auVar111._16_4_) |
         (uint)!bVar13 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar102._16_4_);
    bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
    auVar126._20_4_ =
         (uint)bVar13 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar111._20_4_) |
         (uint)!bVar13 * ((uint)bVar32 * -0x800000 | (uint)!bVar32 * auVar102._20_4_);
    bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
    auVar126._24_4_ =
         (uint)bVar13 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar111._24_4_) |
         (uint)!bVar13 * ((uint)bVar40 * -0x800000 | (uint)!bVar40 * auVar102._24_4_);
    bVar13 = SUB81(uVar92 >> 7,0);
    auVar126._28_4_ =
         (uint)bVar13 * ((uint)bVar47 * -0x800000 | (uint)!bVar47 * auVar111._28_4_) |
         (uint)!bVar13 * ((uint)bVar48 * -0x800000 | (uint)!bVar48 * auVar102._28_4_);
    auVar102 = vmaxps_avx512vl(auVar124,auVar126);
    auVar180 = ZEXT3264(auVar102);
    auVar155._0_4_ = auVar139._0_4_ + auVar101._0_4_;
    auVar155._4_4_ = auVar139._4_4_ + auVar101._4_4_;
    auVar155._8_4_ = auVar139._8_4_ + auVar101._8_4_;
    auVar155._12_4_ = auVar139._12_4_ + auVar101._12_4_;
    auVar155._16_4_ = auVar139._16_4_ + auVar101._16_4_;
    auVar155._20_4_ = auVar139._20_4_ + auVar101._20_4_;
    auVar155._24_4_ = auVar139._24_4_ + auVar101._24_4_;
    auVar155._28_4_ = auVar101._28_4_ + 0.0;
    uVar92 = vcmpps_avx512vl(auVar160,auVar155,2);
    uVar175 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar176._4_4_ = uVar175;
    auVar176._0_4_ = uVar175;
    auVar176._8_4_ = uVar175;
    auVar176._12_4_ = uVar175;
    auVar176._16_4_ = uVar175;
    auVar176._20_4_ = uVar175;
    auVar176._24_4_ = uVar175;
    auVar176._28_4_ = uVar175;
    auVar177 = ZEXT3264(auVar176);
    uVar74 = vcmpps_avx512vl(auVar155,auVar176,2);
    auVar111 = vaddps_avx512vl(auVar139,auVar102);
    auVar164 = ZEXT3264(auVar111);
    uVar70 = vcmpps_avx512vl(auVar160,auVar111,2);
    uVar71 = vcmpps_avx512vl(auVar111,auVar176,2);
    uVar72 = vcmpps_avx512vl(auVar102,auVar173,4);
    bVar90 = (byte)uVar70 & (byte)uVar71 & (byte)uVar72;
    uVar94 = vcmpps_avx512vl(auVar101,auVar114,4);
    uVar94 = uVar92 & uVar74 & uVar94;
    bVar93 = (byte)uVar94 & bVar85;
    bVar84 = bVar85 & ((byte)uVar94 | bVar90);
    uVar91 = (uint)bVar84;
    if (bVar84 != 0) {
      auVar102 = vblendmps_avx512vl(auVar102,auVar101);
      auVar127._0_4_ =
           (float)((uint)(bVar93 & 1) * auVar102._0_4_ |
                  (uint)!(bool)(bVar93 & 1) * (int)auVar155._0_4_);
      bVar13 = (bool)(bVar93 >> 1 & 1);
      auVar127._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * (int)auVar155._4_4_);
      bVar13 = (bool)(bVar93 >> 2 & 1);
      auVar127._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * (int)auVar155._8_4_);
      bVar13 = (bool)(bVar93 >> 3 & 1);
      auVar127._12_4_ =
           (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * (int)auVar155._12_4_);
      bVar13 = (bool)(bVar93 >> 4 & 1);
      auVar127._16_4_ =
           (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * (int)auVar155._16_4_);
      bVar13 = (bool)(bVar93 >> 5 & 1);
      auVar127._20_4_ =
           (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * (int)auVar155._20_4_);
      bVar13 = (bool)(bVar93 >> 6 & 1);
      auVar127._24_4_ =
           (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * (int)auVar155._24_4_);
      auVar127._28_4_ =
           (float)((uint)(bVar93 >> 7) * auVar102._28_4_ |
                  (uint)!(bool)(bVar93 >> 7) * (int)auVar155._28_4_);
      auVar102 = vblendmps_avx512vl(auVar115,auVar171);
      auVar128._0_4_ =
           (float)((uint)(bVar93 & 1) * auVar102._0_4_ |
                  (uint)!(bool)(bVar93 & 1) * (int)auVar101._0_4_);
      bVar13 = (bool)(bVar93 >> 1 & 1);
      auVar128._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * (int)auVar101._4_4_);
      bVar13 = (bool)(bVar93 >> 2 & 1);
      auVar128._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * (int)auVar101._8_4_);
      bVar13 = (bool)(bVar93 >> 3 & 1);
      auVar128._12_4_ =
           (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * (int)auVar101._12_4_);
      bVar13 = (bool)(bVar93 >> 4 & 1);
      auVar128._16_4_ =
           (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * (int)auVar101._16_4_);
      bVar13 = (bool)(bVar93 >> 5 & 1);
      auVar128._20_4_ =
           (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * (int)auVar101._20_4_);
      bVar13 = (bool)(bVar93 >> 6 & 1);
      auVar128._24_4_ =
           (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * (int)auVar101._24_4_);
      auVar128._28_4_ =
           (uint)(bVar93 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar93 >> 7) * (int)auVar101._28_4_
      ;
      auVar101 = vrcp14ps_avx512vl(auVar108);
      auVar102 = vfnmadd213ps_avx512vl(auVar101,auVar108,auVar117);
      auVar97 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
      auVar172 = ZEXT1664(auVar97);
      auVar83._4_4_ = fVar54 * fVar3 * auVar108._4_4_;
      auVar83._0_4_ = fVar52 * fVar1 * auVar108._0_4_;
      auVar83._8_4_ = fVar57 * fVar55 * auVar108._8_4_;
      auVar83._12_4_ = fVar60 * fVar58 * auVar108._12_4_;
      auVar83._16_4_ = fVar63 * fVar61 * auVar108._16_4_;
      auVar83._20_4_ = fVar66 * fVar64 * auVar108._20_4_;
      auVar83._24_4_ = fVar69 * fVar67 * auVar108._24_4_;
      auVar83._28_4_ = auVar129._28_4_;
      _local_80 = vmulps_avx512vl(auVar104,auVar83);
      auVar101 = vmulps_avx512vl(auVar105,auVar83);
      auVar181 = ZEXT3264(auVar101);
      auVar102 = vmulps_avx512vl(auVar104,auVar144);
      auVar182 = ZEXT3264(auVar102);
      auVar111 = vmulps_avx512vl(auVar105,auVar144);
      auVar192 = ZEXT3264(auVar111);
      uVar70 = vcmpps_avx512vl(auVar127,auVar123,0);
      uVar71 = vcmpps_avx512vl(auVar127,auVar124,0);
      bVar76 = ((byte)uVar70 | (byte)uVar71) & bVar85;
      uVar92 = vcmpps_avx512vl(auVar127,auVar121,0);
      uVar92 = uVar75 & uVar95 & uVar92;
      auVar129 = vmulps_avx512vl(auVar98,auVar127);
      auVar147._0_4_ = auVar129._0_4_ + (float)local_620._0_4_;
      auVar147._4_4_ = auVar129._4_4_ + (float)local_620._4_4_;
      auVar147._8_4_ = auVar129._8_4_ + fStack_618;
      auVar147._12_4_ = auVar129._12_4_ + fStack_614;
      auVar147._16_4_ = auVar129._16_4_ + fStack_610;
      auVar147._20_4_ = auVar129._20_4_ + fStack_60c;
      auVar147._24_4_ = auVar129._24_4_ + fStack_608;
      auVar147._28_4_ = auVar129._28_4_ + local_620._28_4_;
      auVar129 = vmulps_avx512vl(auVar113,auVar147);
      auVar148._0_4_ = local_80._0_4_ + auVar129._0_4_;
      auVar148._4_4_ = local_80._4_4_ + auVar129._4_4_;
      auVar148._8_4_ = local_80._8_4_ + auVar129._8_4_;
      auVar148._12_4_ = local_80._12_4_ + auVar129._12_4_;
      auVar148._16_4_ = local_80._16_4_ + auVar129._16_4_;
      auVar148._20_4_ = local_80._20_4_ + auVar129._20_4_;
      auVar148._24_4_ = local_80._24_4_ + auVar129._24_4_;
      auVar148._28_4_ = local_80._28_4_ + auVar129._28_4_;
      auVar102 = vmulps_avx512vl(auVar102,auVar128);
      local_a0 = vxorps_avx512vl(auVar104,auVar151);
      auVar129 = vblendmps_avx512vl(auVar104,local_a0);
      bVar93 = (byte)uVar92;
      bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
      bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
      bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
      bVar20 = SUB81(uVar92 >> 7,0);
      auVar102 = vsubps_avx512vl(auVar148,auVar102);
      local_540._0_4_ =
           (uint)(bVar76 & 1) * auVar102._0_4_ |
           (uint)!(bool)(bVar76 & 1) *
           ((uint)(bVar93 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar93 & 1) * local_a0._0_4_);
      bVar14 = (bool)(bVar76 >> 1 & 1);
      local_540._4_4_ =
           (uint)bVar14 * auVar102._4_4_ |
           (uint)!bVar14 * ((uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * local_a0._4_4_);
      bVar13 = (bool)(bVar76 >> 2 & 1);
      local_540._8_4_ =
           (uint)bVar13 * auVar102._8_4_ |
           (uint)!bVar13 * ((uint)bVar15 * auVar129._8_4_ | (uint)!bVar15 * local_a0._8_4_);
      bVar13 = (bool)(bVar76 >> 3 & 1);
      local_540._12_4_ =
           (uint)bVar13 * auVar102._12_4_ |
           (uint)!bVar13 * ((uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * local_a0._12_4_);
      bVar13 = (bool)(bVar76 >> 4 & 1);
      local_540._16_4_ =
           (uint)bVar13 * auVar102._16_4_ |
           (uint)!bVar13 * ((uint)bVar17 * auVar129._16_4_ | (uint)!bVar17 * local_a0._16_4_);
      bVar13 = (bool)(bVar76 >> 5 & 1);
      local_540._20_4_ =
           (uint)bVar13 * auVar102._20_4_ |
           (uint)!bVar13 * ((uint)bVar18 * auVar129._20_4_ | (uint)!bVar18 * local_a0._20_4_);
      bVar13 = (bool)(bVar76 >> 6 & 1);
      local_540._24_4_ =
           (uint)bVar13 * auVar102._24_4_ |
           (uint)!bVar13 * ((uint)bVar19 * auVar129._24_4_ | (uint)!bVar19 * local_a0._24_4_);
      local_540._28_4_ =
           (uint)(bVar76 >> 7) * auVar102._28_4_ |
           (uint)!(bool)(bVar76 >> 7) *
           ((uint)bVar20 * auVar129._28_4_ | (uint)!bVar20 * local_a0._28_4_);
      auVar159 = ZEXT3264(local_540);
      auVar102 = vmulps_avx512vl(auVar99,auVar127);
      auVar102 = vaddps_avx512vl(auVar107,auVar102);
      auVar102 = vmulps_avx512vl(auVar113,auVar102);
      auVar101 = vaddps_avx512vl(auVar101,auVar102);
      iVar132 = (uint)!(bool)(bVar93 & 1) * auVar117._0_4_;
      iVar96 = (uint)!(bool)((byte)(uVar92 >> 1) & 1) * auVar117._4_4_;
      iVar133 = (uint)!(bool)((byte)(uVar92 >> 2) & 1) * auVar117._8_4_;
      iVar134 = (uint)!(bool)((byte)(uVar92 >> 3) & 1) * auVar117._12_4_;
      iVar135 = (uint)!(bool)((byte)(uVar92 >> 4) & 1) * auVar117._16_4_;
      iVar136 = (uint)!(bool)((byte)(uVar92 >> 5) & 1) * auVar117._20_4_;
      iVar137 = (uint)!(bool)((byte)(uVar92 >> 6) & 1) * auVar117._24_4_;
      iVar138 = (uint)!SUB81(uVar92 >> 7,0) * auVar117._28_4_;
      auVar183 = ZEXT3264(CONCAT428(iVar138,CONCAT424(iVar137,CONCAT420(iVar136,CONCAT416(iVar135,
                                                  CONCAT412(iVar134,CONCAT48(iVar133,CONCAT44(iVar96
                                                  ,iVar132))))))));
      auVar102 = vmulps_avx512vl(auVar128,ZEXT1632(auVar97));
      bVar13 = (bool)(bVar76 >> 1 & 1);
      bVar14 = (bool)(bVar76 >> 2 & 1);
      bVar15 = (bool)(bVar76 >> 3 & 1);
      bVar16 = (bool)(bVar76 >> 4 & 1);
      bVar17 = (bool)(bVar76 >> 5 & 1);
      bVar18 = (bool)(bVar76 >> 6 & 1);
      local_5a0[0] = (uint)(bVar76 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar76 & 1) * iVar132;
      local_5a0[1] = (uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * iVar96;
      local_5a0[2] = (uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * iVar133;
      local_5a0[3] = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * iVar134;
      uStack_590 = (uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * iVar135;
      uStack_58c = (uint)bVar17 * auVar102._20_4_ | (uint)!bVar17 * iVar136;
      uStack_588 = (uint)bVar18 * auVar102._24_4_ | (uint)!bVar18 * iVar137;
      uStack_584 = (uint)(bVar76 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar76 >> 7) * iVar138;
      auVar102 = vmulps_avx512vl(auVar111,auVar128);
      local_580 = ZEXT432(0) << 0x20;
      auVar111 = vxorps_avx512vl(auVar105,auVar151);
      auVar161 = ZEXT3264(auVar111);
      local_560._0_4_ = auVar139._0_4_ + auVar127._0_4_;
      local_560._4_4_ = auVar139._4_4_ + auVar127._4_4_;
      local_560._8_4_ = auVar139._8_4_ + auVar127._8_4_;
      local_560._12_4_ = auVar139._12_4_ + auVar127._12_4_;
      local_560._16_4_ = auVar139._16_4_ + auVar127._16_4_;
      local_560._20_4_ = auVar139._20_4_ + auVar127._20_4_;
      local_560._24_4_ = auVar139._24_4_ + auVar127._24_4_;
      local_560._28_4_ = auVar127._28_4_ + 0.0;
      auVar111 = vblendmps_avx512vl(auVar105,auVar111);
      bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
      bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
      bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
      auVar101 = vsubps_avx512vl(auVar101,auVar102);
      local_520[0] = (uint)(bVar76 & 1) * auVar101._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar93 & 1) * auVar111._0_4_ |
                     (uint)!(bool)(bVar93 & 1) * (int)auVar139._0_4_);
      bVar14 = (bool)(bVar76 >> 1 & 1);
      local_520[1] = (uint)bVar14 * auVar101._4_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * (int)auVar139._4_4_);
      bVar13 = (bool)(bVar76 >> 2 & 1);
      local_520[2] = (uint)bVar13 * auVar101._8_4_ |
                     (uint)!bVar13 *
                     ((uint)bVar15 * auVar111._8_4_ | (uint)!bVar15 * (int)auVar139._8_4_);
      bVar13 = (bool)(bVar76 >> 3 & 1);
      local_520[3] = (uint)bVar13 * auVar101._12_4_ |
                     (uint)!bVar13 *
                     ((uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * (int)auVar139._12_4_);
      bVar13 = (bool)(bVar76 >> 4 & 1);
      uStack_510 = (uint)bVar13 * auVar101._16_4_ |
                   (uint)!bVar13 *
                   ((uint)bVar17 * auVar111._16_4_ | (uint)!bVar17 * (int)auVar139._16_4_);
      bVar13 = (bool)(bVar76 >> 5 & 1);
      uStack_50c = (uint)bVar13 * auVar101._20_4_ |
                   (uint)!bVar13 *
                   ((uint)bVar18 * auVar111._20_4_ | (uint)!bVar18 * (int)auVar139._20_4_);
      bVar13 = (bool)(bVar76 >> 6 & 1);
      uStack_508 = (uint)bVar13 * auVar101._24_4_ |
                   (uint)!bVar13 *
                   ((uint)bVar19 * auVar111._24_4_ | (uint)!bVar19 * (int)auVar139._24_4_);
      uStack_504 = (uint)(bVar76 >> 7) * auVar101._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) * (uint)(byte)(uVar92 >> 7) * auVar111._28_4_;
      _local_e0 = vmulps_avx512vl(auVar106,auVar83);
      auVar101 = vmulps_avx512vl(auVar106,auVar144);
      auVar153 = ZEXT3264(auVar101);
      auVar102 = vmulps_avx512vl(auVar100,auVar127);
      auVar100._0_4_ = auVar102._0_4_ + (float)local_4e0._0_4_;
      auVar100._4_4_ = auVar102._4_4_ + (float)local_4e0._4_4_;
      auVar100._8_4_ = auVar102._8_4_ + fStack_4d8;
      auVar100._12_4_ = auVar102._12_4_ + fStack_4d4;
      auVar100._16_4_ = auVar102._16_4_ + fStack_4d0;
      auVar100._20_4_ = auVar102._20_4_ + fStack_4cc;
      auVar100._24_4_ = auVar102._24_4_ + fStack_4c8;
      auVar100._28_4_ = auVar102._28_4_ + fStack_4c4;
      auVar102 = vmulps_avx512vl(auVar113,auVar100);
      auVar113._0_4_ = local_e0._0_4_ + auVar102._0_4_;
      auVar113._4_4_ = local_e0._4_4_ + auVar102._4_4_;
      auVar113._8_4_ = local_e0._8_4_ + auVar102._8_4_;
      auVar113._12_4_ = local_e0._12_4_ + auVar102._12_4_;
      auVar113._16_4_ = local_e0._16_4_ + auVar102._16_4_;
      auVar113._20_4_ = local_e0._20_4_ + auVar102._20_4_;
      auVar113._24_4_ = local_e0._24_4_ + auVar102._24_4_;
      auVar113._28_4_ = local_e0._28_4_ + auVar102._28_4_;
      auVar98._4_4_ = auVar101._4_4_ * auVar128._4_4_;
      auVar98._0_4_ = auVar101._0_4_ * auVar128._0_4_;
      auVar98._8_4_ = auVar101._8_4_ * auVar128._8_4_;
      auVar98._12_4_ = auVar101._12_4_ * auVar128._12_4_;
      auVar98._16_4_ = auVar101._16_4_ * auVar128._16_4_;
      auVar98._20_4_ = auVar101._20_4_ * auVar128._20_4_;
      auVar98._24_4_ = auVar101._24_4_ * auVar128._24_4_;
      auVar98._28_4_ = auVar144._28_4_;
      local_c0 = vxorps_avx512vl(auVar106,auVar151);
      auVar101 = vblendmps_avx512vl(auVar106,local_c0);
      bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
      bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
      bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
      bVar20 = SUB81(uVar92 >> 7,0);
      auVar149 = ZEXT3264(local_560);
      auVar102 = vsubps_avx512vl(auVar113,auVar98);
      local_500[0] = (uint)(bVar76 & 1) * auVar102._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar93 & 1) * auVar101._0_4_ | !(bool)(bVar93 & 1) * local_520[0]);
      bVar14 = (bool)(bVar76 >> 1 & 1);
      local_500[1] = (uint)bVar14 * auVar102._4_4_ |
                     (uint)!bVar14 * ((uint)bVar13 * auVar101._4_4_ | !bVar13 * local_520[1]);
      bVar13 = (bool)(bVar76 >> 2 & 1);
      local_500[2] = (uint)bVar13 * auVar102._8_4_ |
                     (uint)!bVar13 * ((uint)bVar15 * auVar101._8_4_ | !bVar15 * local_520[2]);
      bVar13 = (bool)(bVar76 >> 3 & 1);
      local_500[3] = (uint)bVar13 * auVar102._12_4_ |
                     (uint)!bVar13 * ((uint)bVar16 * auVar101._12_4_ | !bVar16 * local_520[3]);
      bVar13 = (bool)(bVar76 >> 4 & 1);
      uStack_4f0 = (uint)bVar13 * auVar102._16_4_ |
                   (uint)!bVar13 * ((uint)bVar17 * auVar101._16_4_ | !bVar17 * uStack_510);
      bVar13 = (bool)(bVar76 >> 5 & 1);
      uStack_4ec = (uint)bVar13 * auVar102._20_4_ |
                   (uint)!bVar13 * ((uint)bVar18 * auVar101._20_4_ | !bVar18 * uStack_50c);
      bVar13 = (bool)(bVar76 >> 6 & 1);
      uStack_4e8 = (uint)bVar13 * auVar102._24_4_ |
                   (uint)!bVar13 * ((uint)bVar19 * auVar101._24_4_ | !bVar19 * uStack_508);
      uStack_4e4 = (uint)(bVar76 >> 7) * auVar102._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) *
                   ((uint)bVar20 * auVar101._28_4_ | !bVar20 * uStack_504);
      auVar101 = vblendmps_avx512vl(auVar114,local_560);
      auVar99._0_4_ = (uint)(bVar84 & 1) * auVar101._0_4_ | !(bool)(bVar84 & 1) * local_500[0];
      bVar13 = (bool)(bVar84 >> 1 & 1);
      auVar99._4_4_ = (uint)bVar13 * auVar101._4_4_ | !bVar13 * local_500[1];
      bVar13 = (bool)(bVar84 >> 2 & 1);
      auVar99._8_4_ = (uint)bVar13 * auVar101._8_4_ | !bVar13 * local_500[2];
      bVar13 = (bool)(bVar84 >> 3 & 1);
      auVar99._12_4_ = (uint)bVar13 * auVar101._12_4_ | !bVar13 * local_500[3];
      bVar13 = (bool)(bVar84 >> 4 & 1);
      auVar99._16_4_ = (uint)bVar13 * auVar101._16_4_ | !bVar13 * uStack_4f0;
      bVar13 = (bool)(bVar84 >> 5 & 1);
      auVar99._20_4_ = (uint)bVar13 * auVar101._20_4_ | !bVar13 * uStack_4ec;
      bVar13 = (bool)(bVar84 >> 6 & 1);
      auVar99._24_4_ = (uint)bVar13 * auVar101._24_4_ | !bVar13 * uStack_4e8;
      auVar99._28_4_ = (uint)(bVar84 >> 7) * auVar101._28_4_ | !(bool)(bVar84 >> 7) * uStack_4e4;
      auVar101 = vshufps_avx(auVar99,auVar99,0xb1);
      auVar101 = vminps_avx(auVar99,auVar101);
      auVar102 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vminps_avx(auVar101,auVar102);
      auVar102 = vpermpd_avx2(auVar101,0x4e);
      auVar101 = vminps_avx(auVar101,auVar102);
      uVar70 = vcmpps_avx512vl(auVar99,auVar101,0);
      uVar87 = uVar91;
      if (((byte)uVar70 & bVar84) != 0) {
        uVar87 = (uint)((byte)uVar70 & bVar84);
      }
      uVar86 = 0;
      for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
        uVar86 = uVar86 + 1;
      }
      auVar101 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar156 = ZEXT3264(auVar101);
      auVar101 = vpcmpeqd_avx2(local_560,local_560);
      auVar174 = ZEXT3264(auVar101);
      _local_4e0 = auVar103;
LAB_01c537b8:
      bVar93 = (byte)uVar94;
      auVar101 = auVar153._0_32_;
      local_670.hit = local_4c0;
      local_670.valid = (int *)local_640;
      auVar102 = auVar159._0_32_;
      auVar152 = auVar183._0_32_;
      auVar111 = auVar172._0_32_;
      auVar109 = auVar191._0_32_;
      auVar106 = auVar190._0_32_;
      auVar103 = auVar161._0_32_;
      auVar105 = auVar189._0_32_;
      auVar110 = auVar192._0_32_;
      auVar113 = auVar194._0_32_;
      auVar150 = auVar182._0_32_;
      auVar122 = auVar181._0_32_;
      auVar114 = auVar195._0_32_;
      auVar112 = auVar193._0_32_;
      auVar104 = auVar188._0_32_;
      auVar100 = auVar187._0_32_;
      auVar98 = auVar186._0_32_;
      auVar154 = auVar184._0_32_;
      auVar107 = auVar179._0_32_;
      auVar108 = auVar180._0_32_;
      auVar129 = auVar178._0_32_;
      uVar89 = uVar86 & 0xff;
      uVar87 = *(uint *)(local_100 + (ulong)uVar89 * 4);
      pGVar10 = (pSVar9->geometries).items[uVar87].ptr;
      local_670.ray = (RTCRayN *)ray;
      if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
        uVar91 = (uint)(byte)(~(byte)(1 << (uVar86 & 0x1f)) & (byte)uVar91);
        auVar140 = auVar99;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar95 = (ulong)(uVar89 << 2);
          uVar175 = *(undefined4 *)((long)local_5a0 + uVar95);
          uVar4 = *(undefined4 *)(local_580 + uVar95);
          auVar177 = ZEXT464(*(uint *)(local_560 + uVar95));
          *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_560 + uVar95);
          *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_540 + uVar95);
          *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_520 + uVar95);
          *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_500 + uVar95);
          *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar175;
          *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x220) =
               *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
          *(uint *)(ray + k * 4 + 0x240) = uVar87;
          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_01c53e2b:
          uVar175 = auVar177._0_4_;
          auVar141._4_4_ = uVar175;
          auVar141._0_4_ = uVar175;
          auVar141._8_4_ = uVar175;
          auVar141._12_4_ = uVar175;
          auVar141._16_4_ = uVar175;
          auVar141._20_4_ = uVar175;
          auVar141._24_4_ = uVar175;
          auVar141._28_4_ = uVar175;
          local_560 = auVar164._0_32_;
          uVar70 = vcmpps_avx512vl(local_560,auVar141,2);
          bVar85 = bVar93 & (byte)uVar70 & bVar90 & bVar85;
          uVar91 = (uint)bVar85;
          if (bVar85 == 0) {
            return;
          }
          uVar70 = vcmpps_avx512vl(auVar108,auVar129,0);
          uVar71 = vcmpps_avx512vl(auVar108,auVar107,0);
          bVar84 = (byte)uVar70 | (byte)uVar71;
          uVar95 = vcmpps_avx512vl(auVar108,auVar154,0);
          auVar129 = vmulps_avx512vl(auVar98,auVar108);
          auVar107 = vmulps_avx512vl(auVar100,auVar108);
          auVar108 = vmulps_avx512vl(auVar104,auVar108);
          auVar142._0_4_ = auVar129._0_4_ + (float)local_620._0_4_;
          auVar142._4_4_ = auVar129._4_4_ + (float)local_620._4_4_;
          auVar142._8_4_ = auVar129._8_4_ + fStack_618;
          auVar142._12_4_ = auVar129._12_4_ + fStack_614;
          auVar142._16_4_ = auVar129._16_4_ + fStack_610;
          auVar142._20_4_ = auVar129._20_4_ + fStack_60c;
          auVar142._24_4_ = auVar129._24_4_ + fStack_608;
          auVar142._28_4_ = auVar129._28_4_ + fStack_604;
          auVar129 = vaddps_avx512vl(auVar112,auVar107);
          auVar145._0_4_ = auVar108._0_4_ + (float)local_4e0._0_4_;
          auVar145._4_4_ = auVar108._4_4_ + (float)local_4e0._4_4_;
          auVar145._8_4_ = auVar108._8_4_ + fStack_4d8;
          auVar145._12_4_ = auVar108._12_4_ + fStack_4d4;
          auVar145._16_4_ = auVar108._16_4_ + fStack_4d0;
          auVar145._20_4_ = auVar108._20_4_ + fStack_4cc;
          auVar145._24_4_ = auVar108._24_4_ + fStack_4c8;
          auVar145._28_4_ = auVar108._28_4_ + fStack_4c4;
          auVar107 = vmulps_avx512vl(auVar114,auVar142);
          auVar129 = vmulps_avx512vl(auVar114,auVar129);
          auVar108 = vmulps_avx512vl(auVar114,auVar145);
          auVar143._0_4_ = auVar107._0_4_ + (float)local_80._0_4_;
          auVar143._4_4_ = auVar107._4_4_ + (float)local_80._4_4_;
          auVar143._8_4_ = auVar107._8_4_ + fStack_78;
          auVar143._12_4_ = auVar107._12_4_ + fStack_74;
          auVar143._16_4_ = auVar107._16_4_ + fStack_70;
          auVar143._20_4_ = auVar107._20_4_ + fStack_6c;
          auVar143._24_4_ = auVar107._24_4_ + fStack_68;
          auVar143._28_4_ = auVar107._28_4_ + fStack_64;
          auVar129 = vaddps_avx512vl(auVar122,auVar129);
          auVar146._0_4_ = auVar108._0_4_ + (float)local_e0._0_4_;
          auVar146._4_4_ = auVar108._4_4_ + (float)local_e0._4_4_;
          auVar146._8_4_ = auVar108._8_4_ + fStack_d8;
          auVar146._12_4_ = auVar108._12_4_ + fStack_d4;
          auVar146._16_4_ = auVar108._16_4_ + fStack_d0;
          auVar146._20_4_ = auVar108._20_4_ + fStack_cc;
          auVar146._24_4_ = auVar108._24_4_ + fStack_c8;
          auVar146._28_4_ = auVar108._28_4_ + fStack_c4;
          auVar107 = vmulps_avx512vl(auVar150,auVar113);
          auVar108 = vmulps_avx512vl(auVar110,auVar113);
          auVar101 = vmulps_avx512vl(auVar101,auVar113);
          bVar93 = (byte)uVar95;
          bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
          bVar32 = (bool)((byte)(uVar95 >> 3) & 1);
          bVar25 = (bool)((byte)(uVar95 >> 4) & 1);
          bVar33 = (bool)((byte)(uVar95 >> 5) & 1);
          bVar41 = (bool)((byte)(uVar95 >> 6) & 1);
          bVar49 = SUB81(uVar95 >> 7,0);
          bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar95 >> 2) & 1);
          bVar39 = (bool)((byte)(uVar95 >> 3) & 1);
          bVar26 = (bool)((byte)(uVar95 >> 4) & 1);
          bVar34 = (bool)((byte)(uVar95 >> 5) & 1);
          bVar42 = (bool)((byte)(uVar95 >> 6) & 1);
          bVar50 = SUB81(uVar95 >> 7,0);
          bVar15 = (bool)((byte)(uVar95 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar95 >> 2) & 1);
          bVar40 = (bool)((byte)(uVar95 >> 3) & 1);
          bVar27 = (bool)((byte)(uVar95 >> 4) & 1);
          bVar35 = (bool)((byte)(uVar95 >> 5) & 1);
          bVar43 = (bool)((byte)(uVar95 >> 6) & 1);
          bVar51 = SUB81(uVar95 >> 7,0);
          auVar107 = vsubps_avx512vl(auVar143,auVar107);
          bVar16 = (bool)(bVar84 >> 1 & 1);
          bVar23 = (bool)(bVar84 >> 2 & 1);
          bVar47 = (bool)(bVar84 >> 3 & 1);
          bVar28 = (bool)(bVar84 >> 4 & 1);
          bVar36 = (bool)(bVar84 >> 5 & 1);
          bVar44 = (bool)(bVar84 >> 6 & 1);
          auVar129 = vsubps_avx512vl(auVar129,auVar108);
          bVar17 = (bool)(bVar84 >> 1 & 1);
          bVar24 = (bool)(bVar84 >> 2 & 1);
          bVar48 = (bool)(bVar84 >> 3 & 1);
          bVar29 = (bool)(bVar84 >> 4 & 1);
          bVar37 = (bool)(bVar84 >> 5 & 1);
          bVar45 = (bool)(bVar84 >> 6 & 1);
          auVar111 = vmulps_avx512vl(auVar113,auVar111);
          bVar18 = (bool)(bVar84 >> 1 & 1);
          bVar31 = (bool)(bVar84 >> 2 & 1);
          bVar22 = (bool)(bVar84 >> 3 & 1);
          bVar30 = (bool)(bVar84 >> 4 & 1);
          bVar38 = (bool)(bVar84 >> 5 & 1);
          bVar46 = (bool)(bVar84 >> 6 & 1);
          local_5a0[0] = (uint)(bVar84 & 1) * auVar111._0_4_ |
                         (uint)!(bool)(bVar84 & 1) * auVar152._0_4_;
          local_5a0[1] = (uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar152._4_4_;
          local_5a0[2] = (uint)bVar31 * auVar111._8_4_ | (uint)!bVar31 * auVar152._8_4_;
          local_5a0[3] = (uint)bVar22 * auVar111._12_4_ | (uint)!bVar22 * auVar152._12_4_;
          uStack_590 = (uint)bVar30 * auVar111._16_4_ | (uint)!bVar30 * auVar152._16_4_;
          uStack_58c = (uint)bVar38 * auVar111._20_4_ | (uint)!bVar38 * auVar152._20_4_;
          uStack_588 = (uint)bVar46 * auVar111._24_4_ | (uint)!bVar46 * auVar152._24_4_;
          uStack_584 = (uint)(bVar84 >> 7) * auVar111._28_4_ |
                       (uint)!(bool)(bVar84 >> 7) * auVar152._28_4_;
          auVar101 = vsubps_avx512vl(auVar146,auVar101);
          bVar18 = (bool)(bVar84 >> 1 & 1);
          bVar31 = (bool)(bVar84 >> 2 & 1);
          bVar22 = (bool)(bVar84 >> 3 & 1);
          bVar30 = (bool)(bVar84 >> 4 & 1);
          bVar38 = (bool)(bVar84 >> 5 & 1);
          bVar46 = (bool)(bVar84 >> 6 & 1);
          local_580 = ZEXT432(0) << 0x20;
          local_540._4_4_ =
               (uint)bVar16 * auVar107._4_4_ |
               (uint)!bVar16 * ((uint)bVar13 * local_a0._4_4_ | (uint)!bVar13 * auVar105._4_4_);
          local_540._0_4_ =
               (uint)(bVar84 & 1) * auVar107._0_4_ |
               (uint)!(bool)(bVar84 & 1) *
               ((uint)(bVar93 & 1) * local_a0._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar105._0_4_);
          local_540._8_4_ =
               (uint)bVar23 * auVar107._8_4_ |
               (uint)!bVar23 * ((uint)bVar19 * local_a0._8_4_ | (uint)!bVar19 * auVar105._8_4_);
          local_540._12_4_ =
               (uint)bVar47 * auVar107._12_4_ |
               (uint)!bVar47 * ((uint)bVar32 * local_a0._12_4_ | (uint)!bVar32 * auVar105._12_4_);
          local_540._16_4_ =
               (uint)bVar28 * auVar107._16_4_ |
               (uint)!bVar28 * ((uint)bVar25 * local_a0._16_4_ | (uint)!bVar25 * auVar105._16_4_);
          local_540._20_4_ =
               (uint)bVar36 * auVar107._20_4_ |
               (uint)!bVar36 * ((uint)bVar33 * local_a0._20_4_ | (uint)!bVar33 * auVar105._20_4_);
          local_540._24_4_ =
               (uint)bVar44 * auVar107._24_4_ |
               (uint)!bVar44 * ((uint)bVar41 * local_a0._24_4_ | (uint)!bVar41 * auVar105._24_4_);
          local_540._28_4_ =
               (uint)(bVar84 >> 7) * auVar107._28_4_ |
               (uint)!(bool)(bVar84 >> 7) *
               ((uint)bVar49 * local_a0._28_4_ | (uint)!bVar49 * auVar105._28_4_);
          local_520[0] = (uint)(bVar84 & 1) * auVar129._0_4_ |
                         (uint)!(bool)(bVar84 & 1) *
                         ((uint)(bVar93 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * auVar106._0_4_);
          local_520[1] = (uint)bVar17 * auVar129._4_4_ |
                         (uint)!bVar17 *
                         ((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar106._4_4_);
          local_520[2] = (uint)bVar24 * auVar129._8_4_ |
                         (uint)!bVar24 *
                         ((uint)bVar20 * auVar103._8_4_ | (uint)!bVar20 * auVar106._8_4_);
          local_520[3] = (uint)bVar48 * auVar129._12_4_ |
                         (uint)!bVar48 *
                         ((uint)bVar39 * auVar103._12_4_ | (uint)!bVar39 * auVar106._12_4_);
          uStack_510 = (uint)bVar29 * auVar129._16_4_ |
                       (uint)!bVar29 *
                       ((uint)bVar26 * auVar103._16_4_ | (uint)!bVar26 * auVar106._16_4_);
          uStack_50c = (uint)bVar37 * auVar129._20_4_ |
                       (uint)!bVar37 *
                       ((uint)bVar34 * auVar103._20_4_ | (uint)!bVar34 * auVar106._20_4_);
          uStack_508 = (uint)bVar45 * auVar129._24_4_ |
                       (uint)!bVar45 *
                       ((uint)bVar42 * auVar103._24_4_ | (uint)!bVar42 * auVar106._24_4_);
          uStack_504 = (uint)(bVar84 >> 7) * auVar129._28_4_ |
                       (uint)!(bool)(bVar84 >> 7) *
                       ((uint)bVar50 * auVar103._28_4_ | (uint)!bVar50 * auVar106._28_4_);
          local_500[0] = (uint)(bVar84 & 1) * auVar101._0_4_ |
                         (uint)!(bool)(bVar84 & 1) *
                         ((uint)(bVar93 & 1) * local_c0._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * auVar109._0_4_);
          local_500[1] = (uint)bVar18 * auVar101._4_4_ |
                         (uint)!bVar18 *
                         ((uint)bVar15 * local_c0._4_4_ | (uint)!bVar15 * auVar109._4_4_);
          local_500[2] = (uint)bVar31 * auVar101._8_4_ |
                         (uint)!bVar31 *
                         ((uint)bVar21 * local_c0._8_4_ | (uint)!bVar21 * auVar109._8_4_);
          local_500[3] = (uint)bVar22 * auVar101._12_4_ |
                         (uint)!bVar22 *
                         ((uint)bVar40 * local_c0._12_4_ | (uint)!bVar40 * auVar109._12_4_);
          uStack_4f0 = (uint)bVar30 * auVar101._16_4_ |
                       (uint)!bVar30 *
                       ((uint)bVar27 * local_c0._16_4_ | (uint)!bVar27 * auVar109._16_4_);
          uStack_4ec = (uint)bVar38 * auVar101._20_4_ |
                       (uint)!bVar38 *
                       ((uint)bVar35 * local_c0._20_4_ | (uint)!bVar35 * auVar109._20_4_);
          uStack_4e8 = (uint)bVar46 * auVar101._24_4_ |
                       (uint)!bVar46 *
                       ((uint)bVar43 * local_c0._24_4_ | (uint)!bVar43 * auVar109._24_4_);
          uStack_4e4 = (uint)(bVar84 >> 7) * auVar101._28_4_ |
                       (uint)!(bool)(bVar84 >> 7) *
                       ((uint)bVar51 * local_c0._28_4_ | (uint)!bVar51 * auVar109._28_4_);
          auVar88 = (undefined1  [8])context->scene;
          auVar101 = vblendmps_avx512vl(auVar185._0_32_,local_560);
          auVar130._4_4_ = (uint)(bVar85 >> 1 & 1) * auVar101._4_4_;
          auVar130._0_4_ = (uint)(bVar85 & 1) * auVar101._0_4_;
          auVar130._8_4_ = (uint)(bVar85 >> 2 & 1) * auVar101._8_4_;
          auVar130._12_4_ = (uint)(bVar85 >> 3 & 1) * auVar101._12_4_;
          auVar130._16_4_ = (uint)(bVar85 >> 4 & 1) * auVar101._16_4_;
          auVar130._20_4_ = (uint)(bVar85 >> 5 & 1) * auVar101._20_4_;
          auVar130._24_4_ = (uint)(bVar85 >> 6 & 1) * auVar101._24_4_;
          auVar130._28_4_ = (uint)(bVar85 >> 7) * auVar101._28_4_;
          auVar101 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar101 = vminps_avx(auVar130,auVar101);
          auVar103 = vshufpd_avx(auVar101,auVar101,5);
          auVar101 = vminps_avx(auVar101,auVar103);
          auVar103 = vpermpd_avx2(auVar101,0x4e);
          auVar101 = vminps_avx(auVar101,auVar103);
          uVar70 = vcmpps_avx512vl(auVar130,auVar101,0);
          uVar87 = uVar91;
          if (((byte)uVar70 & bVar85) != 0) {
            uVar87 = (uint)((byte)uVar70 & bVar85);
          }
          uVar86 = 0;
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
            uVar86 = uVar86 + 1;
          }
          auVar101 = vpcmpeqd_avx2(auVar102,auVar102);
          auVar186 = ZEXT3264(auVar101);
          do {
            local_670.hit = local_4c0;
            local_670.valid = (int *)local_640;
            uVar89 = uVar86 & 0xff;
            uVar87 = *(uint *)(local_100 + (ulong)uVar89 * 4);
            pGVar10 = (((Scene *)auVar88)->geometries).items[uVar87].ptr;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              uVar91 = (uint)(byte)(~(byte)(1 << (uVar86 & 0x1f)) & (byte)uVar91);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar95 = (ulong)(uVar89 << 2);
                uVar175 = *(undefined4 *)((long)local_5a0 + uVar95);
                uVar4 = *(undefined4 *)(local_580 + uVar95);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar95);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_540 + uVar95);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_520 + uVar95);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_500 + uVar95);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar175;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
                *(uint *)(ray + k * 4 + 0x240) = uVar87;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                return;
              }
              uVar95 = (ulong)(uVar89 * 4);
              local_460 = *(undefined4 *)((long)local_5a0 + uVar95);
              local_440 = *(undefined4 *)(local_580 + uVar95);
              local_400 = vpbroadcastd_avx512vl();
              uVar175 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
              local_420._4_4_ = uVar175;
              local_420._0_4_ = uVar175;
              local_420._8_4_ = uVar175;
              local_420._12_4_ = uVar175;
              local_420._16_4_ = uVar175;
              local_420._20_4_ = uVar175;
              local_420._24_4_ = uVar175;
              local_420._28_4_ = uVar175;
              uVar175 = *(undefined4 *)(local_540 + uVar95);
              uVar4 = *(undefined4 *)((long)local_520 + uVar95);
              local_4a0._4_4_ = uVar4;
              local_4a0._0_4_ = uVar4;
              local_4a0._8_4_ = uVar4;
              local_4a0._12_4_ = uVar4;
              local_4a0._16_4_ = uVar4;
              local_4a0._20_4_ = uVar4;
              local_4a0._24_4_ = uVar4;
              local_4a0._28_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)local_500 + uVar95);
              local_480._4_4_ = uVar4;
              local_480._0_4_ = uVar4;
              local_480._8_4_ = uVar4;
              local_480._12_4_ = uVar4;
              local_480._16_4_ = uVar4;
              local_480._20_4_ = uVar4;
              local_480._24_4_ = uVar4;
              local_480._28_4_ = uVar4;
              local_4c0[0] = (RTCHitN)(char)uVar175;
              local_4c0[1] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[2] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[3] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              local_4c0[4] = (RTCHitN)(char)uVar175;
              local_4c0[5] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[6] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[7] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              local_4c0[8] = (RTCHitN)(char)uVar175;
              local_4c0[9] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[10] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[0xb] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              local_4c0[0xc] = (RTCHitN)(char)uVar175;
              local_4c0[0xd] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[0xe] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[0xf] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              local_4c0[0x10] = (RTCHitN)(char)uVar175;
              local_4c0[0x11] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[0x12] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[0x13] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              local_4c0[0x14] = (RTCHitN)(char)uVar175;
              local_4c0[0x15] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[0x16] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[0x17] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              local_4c0[0x18] = (RTCHitN)(char)uVar175;
              local_4c0[0x19] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[0x1a] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[0x1b] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              local_4c0[0x1c] = (RTCHitN)(char)uVar175;
              local_4c0[0x1d] = (RTCHitN)(char)((uint)uVar175 >> 8);
              local_4c0[0x1e] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
              local_4c0[0x1f] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
              uStack_45c = local_460;
              uStack_458 = local_460;
              uStack_454 = local_460;
              uStack_450 = local_460;
              uStack_44c = local_460;
              uStack_448 = local_460;
              uStack_444 = local_460;
              uStack_43c = local_440;
              uStack_438 = local_440;
              uStack_434 = local_440;
              uStack_430 = local_440;
              uStack_42c = local_440;
              uStack_428 = local_440;
              uStack_424 = local_440;
              uStack_3dc = context->user->instID[0];
              local_3e0 = uStack_3dc;
              uStack_3d8 = uStack_3dc;
              uStack_3d4 = uStack_3dc;
              uStack_3d0 = uStack_3dc;
              uStack_3cc = uStack_3dc;
              uStack_3c8 = uStack_3dc;
              uStack_3c4 = uStack_3dc;
              uStack_3bc = context->user->instPrimID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = uStack_3bc;
              uStack_3ac = uStack_3bc;
              uStack_3a8 = uStack_3bc;
              uStack_3a4 = uStack_3bc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar95);
              local_640 = auVar156._0_32_;
              local_670.geometryUserPtr = pGVar10->userPtr;
              local_670.context = context->user;
              local_670.N = 8;
              local_5c0 = auVar164._0_32_;
              local_5e0 = auVar177._0_32_;
              local_620 = auVar88;
              local_670.ray = (RTCRayN *)ray;
              local_600 = local_640;
              if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar101 = ZEXT1632(auVar186._0_16_);
                (*pGVar10->intersectionFilterN)(&local_670);
                auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
                auVar186 = ZEXT3264(auVar101);
                auVar156 = ZEXT3264(local_600);
                auVar177 = ZEXT3264(local_5e0);
                auVar164 = ZEXT3264(local_5c0);
                auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar185 = ZEXT3264(auVar101);
                auVar88 = local_620;
              }
              if (local_640 == (undefined1  [32])0x0) {
LAB_01c542e2:
                *(int *)(ray + k * 4 + 0x100) = auVar177._0_4_;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar101 = ZEXT1632(auVar186._0_16_);
                  (*p_Var12)(&local_670);
                  auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
                  auVar186 = ZEXT3264(auVar101);
                  auVar156 = ZEXT3264(local_600);
                  auVar177 = ZEXT3264(local_5e0);
                  auVar164 = ZEXT3264(local_5c0);
                  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar185 = ZEXT3264(auVar101);
                  auVar88 = local_620;
                }
                if (local_640 == (undefined1  [32])0x0) goto LAB_01c542e2;
                uVar95 = vptestmd_avx512vl(local_640,local_640);
                iVar96 = *(int *)(local_670.hit + 4);
                iVar132 = *(int *)(local_670.hit + 8);
                iVar133 = *(int *)(local_670.hit + 0xc);
                iVar134 = *(int *)(local_670.hit + 0x10);
                iVar135 = *(int *)(local_670.hit + 0x14);
                iVar136 = *(int *)(local_670.hit + 0x18);
                iVar137 = *(int *)(local_670.hit + 0x1c);
                bVar85 = (byte)uVar95;
                bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar95 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar95 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar95 >> 6) & 1);
                bVar19 = SUB81(uVar95 >> 7,0);
                *(uint *)(local_670.ray + 0x180) =
                     (uint)(bVar85 & 1) * *(int *)local_670.hit |
                     (uint)!(bool)(bVar85 & 1) * *(int *)(local_670.ray + 0x180);
                *(uint *)(local_670.ray + 0x184) =
                     (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x184);
                *(uint *)(local_670.ray + 0x188) =
                     (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x188);
                *(uint *)(local_670.ray + 0x18c) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x18c);
                *(uint *)(local_670.ray + 400) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 400);
                *(uint *)(local_670.ray + 0x194) =
                     (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x194);
                *(uint *)(local_670.ray + 0x198) =
                     (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x198);
                *(uint *)(local_670.ray + 0x19c) =
                     (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x19c);
                iVar96 = *(int *)(local_670.hit + 0x24);
                iVar132 = *(int *)(local_670.hit + 0x28);
                iVar133 = *(int *)(local_670.hit + 0x2c);
                iVar134 = *(int *)(local_670.hit + 0x30);
                iVar135 = *(int *)(local_670.hit + 0x34);
                iVar136 = *(int *)(local_670.hit + 0x38);
                iVar137 = *(int *)(local_670.hit + 0x3c);
                bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar95 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar95 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar95 >> 6) & 1);
                bVar19 = SUB81(uVar95 >> 7,0);
                *(uint *)(local_670.ray + 0x1a0) =
                     (uint)(bVar85 & 1) * *(int *)(local_670.hit + 0x20) |
                     (uint)!(bool)(bVar85 & 1) * *(int *)(local_670.ray + 0x1a0);
                *(uint *)(local_670.ray + 0x1a4) =
                     (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1a4);
                *(uint *)(local_670.ray + 0x1a8) =
                     (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1a8);
                *(uint *)(local_670.ray + 0x1ac) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ac);
                *(uint *)(local_670.ray + 0x1b0) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1b0);
                *(uint *)(local_670.ray + 0x1b4) =
                     (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1b4);
                *(uint *)(local_670.ray + 0x1b8) =
                     (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1b8);
                *(uint *)(local_670.ray + 0x1bc) =
                     (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1bc);
                iVar96 = *(int *)(local_670.hit + 0x44);
                iVar132 = *(int *)(local_670.hit + 0x48);
                iVar133 = *(int *)(local_670.hit + 0x4c);
                iVar134 = *(int *)(local_670.hit + 0x50);
                iVar135 = *(int *)(local_670.hit + 0x54);
                iVar136 = *(int *)(local_670.hit + 0x58);
                iVar137 = *(int *)(local_670.hit + 0x5c);
                bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar95 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar95 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar95 >> 6) & 1);
                bVar19 = SUB81(uVar95 >> 7,0);
                *(uint *)(local_670.ray + 0x1c0) =
                     (uint)(bVar85 & 1) * *(int *)(local_670.hit + 0x40) |
                     (uint)!(bool)(bVar85 & 1) * *(int *)(local_670.ray + 0x1c0);
                *(uint *)(local_670.ray + 0x1c4) =
                     (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1c4);
                *(uint *)(local_670.ray + 0x1c8) =
                     (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1c8);
                *(uint *)(local_670.ray + 0x1cc) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1cc);
                *(uint *)(local_670.ray + 0x1d0) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1d0);
                *(uint *)(local_670.ray + 0x1d4) =
                     (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1d4);
                *(uint *)(local_670.ray + 0x1d8) =
                     (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1d8);
                *(uint *)(local_670.ray + 0x1dc) =
                     (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1dc);
                iVar96 = *(int *)(local_670.hit + 100);
                iVar132 = *(int *)(local_670.hit + 0x68);
                iVar133 = *(int *)(local_670.hit + 0x6c);
                iVar134 = *(int *)(local_670.hit + 0x70);
                iVar135 = *(int *)(local_670.hit + 0x74);
                iVar136 = *(int *)(local_670.hit + 0x78);
                iVar137 = *(int *)(local_670.hit + 0x7c);
                bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar95 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar95 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar95 >> 6) & 1);
                bVar19 = SUB81(uVar95 >> 7,0);
                *(uint *)(local_670.ray + 0x1e0) =
                     (uint)(bVar85 & 1) * *(int *)(local_670.hit + 0x60) |
                     (uint)!(bool)(bVar85 & 1) * *(int *)(local_670.ray + 0x1e0);
                *(uint *)(local_670.ray + 0x1e4) =
                     (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1e4);
                *(uint *)(local_670.ray + 0x1e8) =
                     (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1e8);
                *(uint *)(local_670.ray + 0x1ec) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ec);
                *(uint *)(local_670.ray + 0x1f0) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1f0);
                *(uint *)(local_670.ray + 500) =
                     (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 500);
                *(uint *)(local_670.ray + 0x1f8) =
                     (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1f8);
                *(uint *)(local_670.ray + 0x1fc) =
                     (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1fc);
                iVar96 = *(int *)(local_670.hit + 0x84);
                iVar132 = *(int *)(local_670.hit + 0x88);
                iVar133 = *(int *)(local_670.hit + 0x8c);
                iVar134 = *(int *)(local_670.hit + 0x90);
                iVar135 = *(int *)(local_670.hit + 0x94);
                iVar136 = *(int *)(local_670.hit + 0x98);
                iVar137 = *(int *)(local_670.hit + 0x9c);
                bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar95 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar95 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar95 >> 6) & 1);
                bVar19 = SUB81(uVar95 >> 7,0);
                *(uint *)(local_670.ray + 0x200) =
                     (uint)(bVar85 & 1) * *(int *)(local_670.hit + 0x80) |
                     (uint)!(bool)(bVar85 & 1) * *(int *)(local_670.ray + 0x200);
                *(uint *)(local_670.ray + 0x204) =
                     (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x204);
                *(uint *)(local_670.ray + 0x208) =
                     (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x208);
                *(uint *)(local_670.ray + 0x20c) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x20c);
                *(uint *)(local_670.ray + 0x210) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x210);
                *(uint *)(local_670.ray + 0x214) =
                     (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x214);
                *(uint *)(local_670.ray + 0x218) =
                     (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x218);
                *(uint *)(local_670.ray + 0x21c) =
                     (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x21c);
                auVar101 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar101;
                auVar101 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar101;
                auVar101 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar101;
                auVar101 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar101;
                auVar177 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              uVar175 = auVar177._0_4_;
              auVar130._4_4_ = uVar175;
              auVar130._0_4_ = uVar175;
              auVar130._8_4_ = uVar175;
              auVar130._12_4_ = uVar175;
              auVar130._16_4_ = uVar175;
              auVar130._20_4_ = uVar175;
              auVar130._24_4_ = uVar175;
              auVar130._28_4_ = uVar175;
              uVar70 = vcmpps_avx512vl(auVar164._0_32_,auVar130,2);
              uVar91 = (uint)(byte)(~(byte)(1 << (uVar86 & 0x1f)) & (byte)uVar91) & (uint)uVar70;
            }
            bVar85 = (byte)uVar91;
            if (bVar85 == 0) {
              return;
            }
            auVar101 = vblendmps_avx512vl(auVar185._0_32_,auVar164._0_32_);
            auVar131._0_4_ =
                 (uint)(bVar85 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar130._0_4_;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar130._4_4_;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar130._8_4_;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar130._12_4_;
            bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
            auVar131._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar130._16_4_;
            bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
            auVar131._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar130._20_4_;
            bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
            auVar131._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar130._24_4_;
            auVar131._28_4_ =
                 (uVar91 >> 7) * auVar101._28_4_ | (uint)!SUB41(uVar91 >> 7,0) * auVar130._28_4_;
            auVar101 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar101 = vminps_avx(auVar131,auVar101);
            auVar102 = vshufpd_avx(auVar101,auVar101,5);
            auVar101 = vminps_avx(auVar101,auVar102);
            auVar102 = vpermpd_avx2(auVar101,0x4e);
            auVar101 = vminps_avx(auVar101,auVar102);
            uVar70 = vcmpps_avx512vl(auVar131,auVar101,0);
            bVar85 = (byte)uVar70 & bVar85;
            uVar87 = uVar91;
            if (bVar85 != 0) {
              uVar87 = (uint)bVar85;
            }
            uVar86 = 0;
            for (; auVar130 = auVar131, (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              uVar86 = uVar86 + 1;
            }
          } while( true );
        }
        local_140 = auVar149._0_32_;
        local_120 = auVar101;
        uVar95 = (ulong)(uVar89 * 4);
        local_460 = *(undefined4 *)((long)local_5a0 + uVar95);
        local_440 = *(undefined4 *)(local_580 + uVar95);
        local_400 = vpbroadcastd_avx512vl();
        local_420._4_4_ = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
        uVar175 = *(undefined4 *)(local_540 + uVar95);
        uVar4 = *(undefined4 *)((long)local_520 + uVar95);
        local_4a0._4_4_ = uVar4;
        local_4a0._0_4_ = uVar4;
        local_4a0._8_4_ = uVar4;
        local_4a0._12_4_ = uVar4;
        local_4a0._16_4_ = uVar4;
        local_4a0._20_4_ = uVar4;
        local_4a0._24_4_ = uVar4;
        local_4a0._28_4_ = uVar4;
        local_480._4_4_ = *(undefined4 *)((long)local_500 + uVar95);
        local_4c0[0] = (RTCHitN)(char)uVar175;
        local_4c0[1] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[2] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[3] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_4c0[4] = (RTCHitN)(char)uVar175;
        local_4c0[5] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[6] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[7] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_4c0[8] = (RTCHitN)(char)uVar175;
        local_4c0[9] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[10] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[0xb] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_4c0[0xc] = (RTCHitN)(char)uVar175;
        local_4c0[0xd] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[0xe] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[0xf] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_4c0[0x10] = (RTCHitN)(char)uVar175;
        local_4c0[0x11] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[0x12] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[0x13] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_4c0[0x14] = (RTCHitN)(char)uVar175;
        local_4c0[0x15] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[0x16] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[0x17] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_4c0[0x18] = (RTCHitN)(char)uVar175;
        local_4c0[0x19] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[0x1a] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[0x1b] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_4c0[0x1c] = (RTCHitN)(char)uVar175;
        local_4c0[0x1d] = (RTCHitN)(char)((uint)uVar175 >> 8);
        local_4c0[0x1e] = (RTCHitN)(char)((uint)uVar175 >> 0x10);
        local_4c0[0x1f] = (RTCHitN)(char)((uint)uVar175 >> 0x18);
        local_480._0_4_ = local_480._4_4_;
        local_480._8_4_ = local_480._4_4_;
        local_480._12_4_ = local_480._4_4_;
        local_480._16_4_ = local_480._4_4_;
        local_480._20_4_ = local_480._4_4_;
        local_480._24_4_ = local_480._4_4_;
        local_480._28_4_ = local_480._4_4_;
        uStack_45c = local_460;
        uStack_458 = local_460;
        uStack_454 = local_460;
        uStack_450 = local_460;
        uStack_44c = local_460;
        uStack_448 = local_460;
        uStack_444 = local_460;
        uStack_43c = local_440;
        uStack_438 = local_440;
        uStack_434 = local_440;
        uStack_430 = local_440;
        uStack_42c = local_440;
        uStack_428 = local_440;
        uStack_424 = local_440;
        local_420._0_4_ = local_420._4_4_;
        local_420._8_4_ = local_420._4_4_;
        local_420._12_4_ = local_420._4_4_;
        local_420._16_4_ = local_420._4_4_;
        local_420._20_4_ = local_420._4_4_;
        local_420._24_4_ = local_420._4_4_;
        local_420._28_4_ = local_420._4_4_;
        uStack_3dc = context->user->instID[0];
        local_3e0 = uStack_3dc;
        uStack_3d8 = uStack_3dc;
        uStack_3d4 = uStack_3dc;
        uStack_3d0 = uStack_3dc;
        uStack_3cc = uStack_3dc;
        uStack_3c8 = uStack_3dc;
        uStack_3c4 = uStack_3dc;
        uStack_3bc = context->user->instPrimID[0];
        local_3c0 = uStack_3bc;
        uStack_3b8 = uStack_3bc;
        uStack_3b4 = uStack_3bc;
        uStack_3b0 = uStack_3bc;
        uStack_3ac = uStack_3bc;
        uStack_3a8 = uStack_3bc;
        uStack_3a4 = uStack_3bc;
        *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar95);
        local_640 = auVar156._0_32_;
        local_670.geometryUserPtr = pGVar10->userPtr;
        local_670.context = context->user;
        local_670.N = 8;
        local_5c0 = auVar164._0_32_;
        local_160 = auVar98;
        local_180 = auVar100;
        local_1a0 = auVar104;
        local_1c0 = auVar105;
        local_1e0 = auVar106;
        local_200 = auVar109;
        local_5e0 = auVar177._0_32_;
        local_220 = auVar112;
        local_240 = auVar114;
        local_260 = auVar152;
        local_280 = auVar113;
        local_2a0 = auVar154;
        local_2c0 = auVar129;
        local_2e0 = auVar107;
        local_300 = auVar108;
        local_320 = auVar111;
        local_340 = auVar122;
        local_360 = auVar150;
        local_380 = auVar110;
        local_3a0 = auVar103;
        uVar95 = uVar94;
        local_600 = local_640;
        if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
          auVar159 = ZEXT1664(auVar159._0_16_);
          auVar101 = ZEXT1632(auVar174._0_16_);
          (*pGVar10->intersectionFilterN)(&local_670);
          auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
          auVar174 = ZEXT3264(auVar101);
          auVar161 = ZEXT3264(local_3a0);
          auVar192 = ZEXT3264(local_380);
          auVar182 = ZEXT3264(local_360);
          auVar181 = ZEXT3264(local_340);
          uVar95 = uVar94 & 0xffff;
          auVar172 = ZEXT3264(local_320);
          auVar180 = ZEXT3264(local_300);
          auVar179 = ZEXT3264(local_2e0);
          auVar178 = ZEXT3264(local_2c0);
          auVar184 = ZEXT3264(local_2a0);
          auVar194 = ZEXT3264(local_280);
          auVar156 = ZEXT3264(local_600);
          auVar183 = ZEXT3264(local_260);
          auVar195 = ZEXT3264(local_240);
          auVar193 = ZEXT3264(local_220);
          auVar177 = ZEXT3264(local_5e0);
          auVar191 = ZEXT3264(local_200);
          auVar190 = ZEXT3264(local_1e0);
          auVar189 = ZEXT3264(local_1c0);
          auVar188 = ZEXT3264(local_1a0);
          auVar187 = ZEXT3264(local_180);
          auVar186 = ZEXT3264(local_160);
          auVar164 = ZEXT3264(local_5c0);
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar185 = ZEXT3264(auVar101);
        }
        auVar153 = ZEXT3264(local_120);
        auVar149 = ZEXT3264(local_140);
        if (local_640 == (undefined1  [32])0x0) {
LAB_01c53d4d:
          *(int *)(ray + k * 4 + 0x100) = auVar177._0_4_;
        }
        else {
          p_Var12 = context->args->filter;
          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
            auVar159 = ZEXT1664(auVar159._0_16_);
            auVar101 = ZEXT1632(auVar174._0_16_);
            (*p_Var12)(&local_670);
            auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
            auVar174 = ZEXT3264(auVar101);
            auVar149 = ZEXT3264(local_140);
            auVar153 = ZEXT3264(local_120);
            auVar161 = ZEXT3264(local_3a0);
            auVar192 = ZEXT3264(local_380);
            auVar182 = ZEXT3264(local_360);
            auVar181 = ZEXT3264(local_340);
            uVar95 = uVar94 & 0xffff;
            auVar172 = ZEXT3264(local_320);
            auVar180 = ZEXT3264(local_300);
            auVar179 = ZEXT3264(local_2e0);
            auVar178 = ZEXT3264(local_2c0);
            auVar184 = ZEXT3264(local_2a0);
            auVar194 = ZEXT3264(local_280);
            auVar156 = ZEXT3264(local_600);
            auVar183 = ZEXT3264(local_260);
            auVar195 = ZEXT3264(local_240);
            auVar193 = ZEXT3264(local_220);
            auVar177 = ZEXT3264(local_5e0);
            auVar191 = ZEXT3264(local_200);
            auVar190 = ZEXT3264(local_1e0);
            auVar189 = ZEXT3264(local_1c0);
            auVar188 = ZEXT3264(local_1a0);
            auVar187 = ZEXT3264(local_180);
            auVar186 = ZEXT3264(local_160);
            auVar164 = ZEXT3264(local_5c0);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar185 = ZEXT3264(auVar101);
          }
          if (local_640 == (undefined1  [32])0x0) goto LAB_01c53d4d;
          uVar75 = vptestmd_avx512vl(local_640,local_640);
          iVar96 = *(int *)(local_670.hit + 4);
          iVar132 = *(int *)(local_670.hit + 8);
          iVar133 = *(int *)(local_670.hit + 0xc);
          iVar134 = *(int *)(local_670.hit + 0x10);
          iVar135 = *(int *)(local_670.hit + 0x14);
          iVar136 = *(int *)(local_670.hit + 0x18);
          iVar137 = *(int *)(local_670.hit + 0x1c);
          bVar93 = (byte)uVar75;
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = SUB81(uVar75 >> 7,0);
          *(uint *)(local_670.ray + 0x180) =
               (uint)(bVar93 & 1) * *(int *)local_670.hit |
               (uint)!(bool)(bVar93 & 1) * *(int *)(local_670.ray + 0x180);
          *(uint *)(local_670.ray + 0x184) =
               (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x184);
          *(uint *)(local_670.ray + 0x188) =
               (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x188);
          *(uint *)(local_670.ray + 0x18c) =
               (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x18c);
          *(uint *)(local_670.ray + 400) =
               (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 400);
          *(uint *)(local_670.ray + 0x194) =
               (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x194);
          *(uint *)(local_670.ray + 0x198) =
               (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x198);
          *(uint *)(local_670.ray + 0x19c) =
               (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x19c);
          iVar96 = *(int *)(local_670.hit + 0x24);
          iVar132 = *(int *)(local_670.hit + 0x28);
          iVar133 = *(int *)(local_670.hit + 0x2c);
          iVar134 = *(int *)(local_670.hit + 0x30);
          iVar135 = *(int *)(local_670.hit + 0x34);
          iVar136 = *(int *)(local_670.hit + 0x38);
          iVar137 = *(int *)(local_670.hit + 0x3c);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = SUB81(uVar75 >> 7,0);
          *(uint *)(local_670.ray + 0x1a0) =
               (uint)(bVar93 & 1) * *(int *)(local_670.hit + 0x20) |
               (uint)!(bool)(bVar93 & 1) * *(int *)(local_670.ray + 0x1a0);
          *(uint *)(local_670.ray + 0x1a4) =
               (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1a4);
          *(uint *)(local_670.ray + 0x1a8) =
               (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1a8);
          *(uint *)(local_670.ray + 0x1ac) =
               (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ac);
          *(uint *)(local_670.ray + 0x1b0) =
               (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1b0);
          *(uint *)(local_670.ray + 0x1b4) =
               (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1b4);
          *(uint *)(local_670.ray + 0x1b8) =
               (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1b8);
          *(uint *)(local_670.ray + 0x1bc) =
               (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1bc);
          iVar96 = *(int *)(local_670.hit + 0x44);
          iVar132 = *(int *)(local_670.hit + 0x48);
          iVar133 = *(int *)(local_670.hit + 0x4c);
          iVar134 = *(int *)(local_670.hit + 0x50);
          iVar135 = *(int *)(local_670.hit + 0x54);
          iVar136 = *(int *)(local_670.hit + 0x58);
          iVar137 = *(int *)(local_670.hit + 0x5c);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = SUB81(uVar75 >> 7,0);
          *(uint *)(local_670.ray + 0x1c0) =
               (uint)(bVar93 & 1) * *(int *)(local_670.hit + 0x40) |
               (uint)!(bool)(bVar93 & 1) * *(int *)(local_670.ray + 0x1c0);
          *(uint *)(local_670.ray + 0x1c4) =
               (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1c4);
          *(uint *)(local_670.ray + 0x1c8) =
               (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1c8);
          *(uint *)(local_670.ray + 0x1cc) =
               (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1cc);
          *(uint *)(local_670.ray + 0x1d0) =
               (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1d0);
          *(uint *)(local_670.ray + 0x1d4) =
               (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1d4);
          *(uint *)(local_670.ray + 0x1d8) =
               (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1d8);
          *(uint *)(local_670.ray + 0x1dc) =
               (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1dc);
          iVar96 = *(int *)(local_670.hit + 100);
          iVar132 = *(int *)(local_670.hit + 0x68);
          iVar133 = *(int *)(local_670.hit + 0x6c);
          iVar134 = *(int *)(local_670.hit + 0x70);
          iVar135 = *(int *)(local_670.hit + 0x74);
          iVar136 = *(int *)(local_670.hit + 0x78);
          iVar137 = *(int *)(local_670.hit + 0x7c);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = SUB81(uVar75 >> 7,0);
          *(uint *)(local_670.ray + 0x1e0) =
               (uint)(bVar93 & 1) * *(int *)(local_670.hit + 0x60) |
               (uint)!(bool)(bVar93 & 1) * *(int *)(local_670.ray + 0x1e0);
          *(uint *)(local_670.ray + 0x1e4) =
               (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1e4);
          *(uint *)(local_670.ray + 0x1e8) =
               (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1e8);
          *(uint *)(local_670.ray + 0x1ec) =
               (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ec);
          *(uint *)(local_670.ray + 0x1f0) =
               (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1f0);
          *(uint *)(local_670.ray + 500) =
               (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 500);
          *(uint *)(local_670.ray + 0x1f8) =
               (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1f8);
          *(uint *)(local_670.ray + 0x1fc) =
               (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1fc);
          iVar96 = *(int *)(local_670.hit + 0x84);
          iVar132 = *(int *)(local_670.hit + 0x88);
          iVar133 = *(int *)(local_670.hit + 0x8c);
          iVar134 = *(int *)(local_670.hit + 0x90);
          iVar135 = *(int *)(local_670.hit + 0x94);
          iVar136 = *(int *)(local_670.hit + 0x98);
          iVar137 = *(int *)(local_670.hit + 0x9c);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = SUB81(uVar75 >> 7,0);
          *(uint *)(local_670.ray + 0x200) =
               (uint)(bVar93 & 1) * *(int *)(local_670.hit + 0x80) |
               (uint)!(bool)(bVar93 & 1) * *(int *)(local_670.ray + 0x200);
          *(uint *)(local_670.ray + 0x204) =
               (uint)bVar13 * iVar96 | (uint)!bVar13 * *(int *)(local_670.ray + 0x204);
          *(uint *)(local_670.ray + 0x208) =
               (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_670.ray + 0x208);
          *(uint *)(local_670.ray + 0x20c) =
               (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_670.ray + 0x20c);
          *(uint *)(local_670.ray + 0x210) =
               (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_670.ray + 0x210);
          *(uint *)(local_670.ray + 0x214) =
               (uint)bVar17 * iVar135 | (uint)!bVar17 * *(int *)(local_670.ray + 0x214);
          *(uint *)(local_670.ray + 0x218) =
               (uint)bVar18 * iVar136 | (uint)!bVar18 * *(int *)(local_670.ray + 0x218);
          *(uint *)(local_670.ray + 0x21c) =
               (uint)bVar19 * iVar137 | (uint)!bVar19 * *(int *)(local_670.ray + 0x21c);
          auVar101 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar101;
          auVar101 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar101;
          auVar101 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar101;
          auVar101 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar101;
          auVar177 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        }
        uVar175 = auVar177._0_4_;
        auVar140._4_4_ = uVar175;
        auVar140._0_4_ = uVar175;
        auVar140._8_4_ = uVar175;
        auVar140._12_4_ = uVar175;
        auVar140._16_4_ = uVar175;
        auVar140._20_4_ = uVar175;
        auVar140._24_4_ = uVar175;
        auVar140._28_4_ = uVar175;
        uVar70 = vcmpps_avx512vl(auVar149._0_32_,auVar140,2);
        uVar91 = (uint)(byte)(~(byte)(1 << (uVar86 & 0x1f)) & (byte)uVar91) & (uint)uVar70;
        uVar94 = uVar95;
      }
      bVar93 = (byte)uVar94;
      auVar101 = auVar153._0_32_;
      auVar102 = auVar159._0_32_;
      auVar152 = auVar183._0_32_;
      auVar111 = auVar172._0_32_;
      auVar109 = auVar191._0_32_;
      auVar106 = auVar190._0_32_;
      auVar103 = auVar161._0_32_;
      auVar105 = auVar189._0_32_;
      auVar110 = auVar192._0_32_;
      auVar113 = auVar194._0_32_;
      auVar150 = auVar182._0_32_;
      auVar122 = auVar181._0_32_;
      auVar114 = auVar195._0_32_;
      auVar112 = auVar193._0_32_;
      auVar104 = auVar188._0_32_;
      auVar100 = auVar187._0_32_;
      auVar98 = auVar186._0_32_;
      auVar154 = auVar184._0_32_;
      auVar107 = auVar179._0_32_;
      auVar108 = auVar180._0_32_;
      auVar129 = auVar178._0_32_;
      bVar84 = (byte)uVar91;
      if (bVar84 == 0) goto LAB_01c53e2b;
      auVar101 = vblendmps_avx512vl(auVar185._0_32_,auVar149._0_32_);
      auVar99._0_4_ =
           (uint)(bVar84 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar140._0_4_;
      bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar99._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar140._4_4_;
      bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar99._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar140._8_4_;
      bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar99._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar140._12_4_;
      bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
      auVar99._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar140._16_4_;
      bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
      auVar99._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar140._20_4_;
      bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
      auVar99._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar140._24_4_;
      auVar99._28_4_ =
           (uVar91 >> 7) * auVar101._28_4_ | (uint)!SUB41(uVar91 >> 7,0) * auVar140._28_4_;
      auVar101 = vshufps_avx(auVar99,auVar99,0xb1);
      auVar101 = vminps_avx(auVar99,auVar101);
      auVar102 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vminps_avx(auVar101,auVar102);
      auVar102 = vpermpd_avx2(auVar101,0x4e);
      auVar101 = vminps_avx(auVar101,auVar102);
      uVar70 = vcmpps_avx512vl(auVar99,auVar101,0);
      bVar84 = (byte)uVar70 & bVar84;
      uVar87 = uVar91;
      if (bVar84 != 0) {
        uVar87 = (uint)bVar84;
      }
      uVar86 = 0;
      for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
        uVar86 = uVar86 + 1;
      }
      goto LAB_01c537b8;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }